

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  size_t k;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  byte bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  int iVar81;
  uint uVar82;
  AABBNodeMB4D *node1;
  ulong uVar83;
  long lVar84;
  long lVar85;
  uint uVar86;
  long lVar87;
  ulong uVar88;
  long lVar89;
  long lVar90;
  ulong uVar91;
  undefined4 uVar92;
  ulong unaff_RBX;
  ulong uVar93;
  NodeRef root;
  Geometry *pGVar94;
  undefined1 auVar95 [8];
  ulong *puVar96;
  undefined1 (*pauVar97) [32];
  ulong uVar98;
  long lVar99;
  RayK<8> *pRVar100;
  RayQueryContext *pRVar101;
  bool bVar102;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar139 [16];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar149;
  float fVar151;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar147 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar178;
  float fVar182;
  undefined1 auVar176 [32];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar192 [32];
  float fVar196;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar205;
  float fVar206;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar227 [16];
  float fVar226;
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  float fVar241;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [32];
  float fVar247;
  float fVar251;
  undefined1 auVar244 [32];
  float fVar252;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar265 [32];
  undefined1 auVar284 [32];
  undefined1 in_ZMM13 [64];
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar286 [32];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  Precalculations pre;
  UVIdentity<8> mapUV;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  vbool<8> valid0;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2f32;
  undefined1 local_2f31;
  ulong local_2f30;
  undefined1 (*local_2f28) [32];
  ulong *local_2f20;
  uint local_2f14;
  uint local_2f10;
  uint local_2f0c;
  RayK<8> *local_2f08;
  undefined1 local_2f00 [32];
  undefined1 local_2ee0 [8];
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [20];
  uint uStack_2e8c;
  uint uStack_2e88;
  uint uStack_2e84;
  BVH *local_2e70;
  Intersectors *local_2e68;
  long local_2e60;
  long local_2e58;
  long local_2e50;
  ulong local_2e48;
  RayK<8> *local_2e40;
  RayQueryContext *local_2e38;
  ulong local_2e30;
  ulong local_2e28;
  ulong local_2e20;
  long local_2e18;
  long local_2e10;
  Scene *local_2e08;
  undefined1 local_2e00 [16];
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined1 local_2de0 [32];
  float local_2dc0;
  float fStack_2dbc;
  float fStack_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  float fStack_2da8;
  float fStack_2da4;
  undefined1 local_2da0 [32];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  RTCFilterFunctionNArguments local_2d50;
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2cc0;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [8];
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  undefined1 local_2be0 [8];
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined1 local_2bc0 [8];
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  float local_2b00 [4];
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  float fStack_2ae4;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 *local_2aa0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  float local_2a00 [4];
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined4 uStack_29e4;
  float local_29e0 [4];
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0 [4];
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  float local_29a0 [4];
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined1 local_2960 [32];
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined4 local_2920;
  undefined4 uStack_291c;
  undefined4 uStack_2918;
  undefined4 uStack_2914;
  undefined4 uStack_2910;
  undefined4 uStack_290c;
  undefined4 uStack_2908;
  undefined4 uStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [8];
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2e70 = (BVH *)This->ptr;
  local_2608 = (local_2e70->root).ptr;
  if (local_2608 != 8) {
    auVar105 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar104 = vpcmpeqd_avx(auVar105,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar105 = vpcmpeqd_avx(auVar105,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar167 = ZEXT816(0) << 0x40;
    auVar109 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar167),5);
    auVar160._16_16_ = auVar105;
    auVar160._0_16_ = auVar104;
    auVar125 = auVar160 & auVar109;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar125 >> 0x7f,0) != '\0') ||
          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar125 >> 0xbf,0) != '\0') ||
        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar125[0x1f] < '\0') {
      local_2880 = vandps_avx(auVar109,auVar160);
      local_2cc0._0_8_ = *(undefined8 *)ray;
      local_2cc0._8_8_ = *(undefined8 *)(ray + 8);
      local_2cc0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2cc0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2cc0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2cc0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2cc0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2cc0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2cc0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2cc0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2cc0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2cc0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2c60 = *(undefined1 (*) [32])(ray + 0x80);
      local_2c40 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2c20 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar228._8_4_ = 0x7fffffff;
      auVar228._0_8_ = 0x7fffffff7fffffff;
      auVar228._12_4_ = 0x7fffffff;
      auVar228._16_4_ = 0x7fffffff;
      auVar228._20_4_ = 0x7fffffff;
      auVar228._24_4_ = 0x7fffffff;
      auVar228._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(auVar228,local_2c60);
      auVar253._8_4_ = 0x219392ef;
      auVar253._0_8_ = 0x219392ef219392ef;
      auVar253._12_4_ = 0x219392ef;
      auVar253._16_4_ = 0x219392ef;
      auVar253._20_4_ = 0x219392ef;
      auVar253._24_4_ = 0x219392ef;
      auVar253._28_4_ = 0x219392ef;
      auVar211._8_4_ = 0x3f800000;
      auVar211._0_8_ = 0x3f8000003f800000;
      auVar211._12_4_ = 0x3f800000;
      auVar211._16_4_ = 0x3f800000;
      auVar211._20_4_ = 0x3f800000;
      auVar211._24_4_ = 0x3f800000;
      auVar211._28_4_ = 0x3f800000;
      auVar125 = vcmpps_avx(auVar109,auVar253,1);
      auVar161 = vdivps_avx(auVar211,local_2c60);
      auVar109 = vandps_avx(auVar228,local_2c40);
      auVar171 = vdivps_avx(auVar211,local_2c40);
      auVar160 = vcmpps_avx(auVar109,auVar253,1);
      auVar188 = vdivps_avx(auVar211,local_2c20);
      auVar109 = vandps_avx(auVar228,local_2c20);
      auVar109 = vcmpps_avx(auVar109,auVar253,1);
      auVar229._8_4_ = 0x5d5e0b6b;
      auVar229._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar229._12_4_ = 0x5d5e0b6b;
      auVar229._16_4_ = 0x5d5e0b6b;
      auVar229._20_4_ = 0x5d5e0b6b;
      auVar229._24_4_ = 0x5d5e0b6b;
      auVar229._28_4_ = 0x5d5e0b6b;
      _local_2c00 = vblendvps_avx(auVar161,auVar229,auVar125);
      _local_2be0 = vblendvps_avx(auVar171,auVar229,auVar160);
      _local_2bc0 = vblendvps_avx(auVar188,auVar229,auVar109);
      auVar109 = vcmpps_avx(_local_2c00,ZEXT1632(auVar167),1);
      auVar188._8_4_ = 0x10;
      auVar188._0_8_ = 0x1000000010;
      auVar188._12_4_ = 0x10;
      auVar188._16_4_ = 0x10;
      auVar188._20_4_ = 0x10;
      auVar188._24_4_ = 0x10;
      auVar188._28_4_ = 0x10;
      local_2ba0 = vandps_avx(auVar109,auVar188);
      auVar125 = ZEXT1632(auVar167);
      auVar109 = vcmpps_avx(_local_2be0,auVar125,5);
      auVar189._8_4_ = 0x20;
      auVar189._0_8_ = 0x2000000020;
      auVar189._12_4_ = 0x20;
      auVar189._16_4_ = 0x20;
      auVar189._20_4_ = 0x20;
      auVar189._24_4_ = 0x20;
      auVar189._28_4_ = 0x20;
      auVar200._8_4_ = 0x30;
      auVar200._0_8_ = 0x3000000030;
      auVar200._12_4_ = 0x30;
      auVar200._16_4_ = 0x30;
      auVar200._20_4_ = 0x30;
      auVar200._24_4_ = 0x30;
      auVar200._28_4_ = 0x30;
      local_2b80 = vblendvps_avx(auVar200,auVar189,auVar109);
      auVar109 = vcmpps_avx(_local_2bc0,auVar125,5);
      auVar171._8_4_ = 0x40;
      auVar171._0_8_ = 0x4000000040;
      auVar171._12_4_ = 0x40;
      auVar171._16_4_ = 0x40;
      auVar171._20_4_ = 0x40;
      auVar171._24_4_ = 0x40;
      auVar171._28_4_ = 0x40;
      auVar190._8_4_ = 0x50;
      auVar190._0_8_ = 0x5000000050;
      auVar190._12_4_ = 0x50;
      auVar190._16_4_ = 0x50;
      auVar190._20_4_ = 0x50;
      auVar190._24_4_ = 0x50;
      auVar190._28_4_ = 0x50;
      local_2b60 = vblendvps_avx(auVar190,auVar171,auVar109);
      auVar109 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar125);
      auVar161._8_4_ = 0x7f800000;
      auVar161._0_8_ = 0x7f8000007f800000;
      auVar161._12_4_ = 0x7f800000;
      auVar161._16_4_ = 0x7f800000;
      auVar161._20_4_ = 0x7f800000;
      auVar161._24_4_ = 0x7f800000;
      auVar161._28_4_ = 0x7f800000;
      local_2b40 = vblendvps_avx(auVar161,auVar109,local_2880);
      auVar109 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar125);
      auVar125._8_4_ = 0xff800000;
      auVar125._0_8_ = 0xff800000ff800000;
      auVar125._12_4_ = 0xff800000;
      auVar125._16_4_ = 0xff800000;
      auVar125._20_4_ = 0xff800000;
      auVar125._24_4_ = 0xff800000;
      auVar125._28_4_ = 0xff800000;
      local_2b20 = vblendvps_avx(auVar125,auVar109,local_2880);
      auVar109 = vcmpps_avx(local_2b20,local_2b20,0xf);
      local_2ea0._4_4_ = local_2880._4_4_ ^ auVar109._4_4_;
      local_2ea0._0_4_ = local_2880._0_4_ ^ auVar109._0_4_;
      local_2ea0._8_4_ = local_2880._8_4_ ^ auVar109._8_4_;
      local_2ea0._12_4_ = local_2880._12_4_ ^ auVar109._12_4_;
      local_2ea0._16_4_ = local_2880._16_4_ ^ auVar109._16_4_;
      uStack_2e8c = local_2880._20_4_ ^ auVar109._20_4_;
      uStack_2e88 = local_2880._24_4_ ^ auVar109._24_4_;
      uStack_2e84 = local_2880._28_4_ ^ auVar109._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_2f30 = 5;
      }
      else {
        local_2f30 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2f08 = ray + 0x100;
      puVar96 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar97 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_1e60 = local_2b40;
      local_27c0._16_16_ = mm_lookupmask_ps._240_16_;
      local_27c0._0_16_ = mm_lookupmask_ps._0_16_;
      auVar147 = ZEXT3264(local_27c0);
      auVar109._8_4_ = 0xbf800000;
      auVar109._0_8_ = 0xbf800000bf800000;
      auVar109._12_4_ = 0xbf800000;
      auVar109._16_4_ = 0xbf800000;
      auVar109._20_4_ = 0xbf800000;
      auVar109._24_4_ = 0xbf800000;
      auVar109._28_4_ = 0xbf800000;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
      _local_27e0 = vblendvps_avx(auVar126,auVar109,local_27c0);
      local_2e68 = This;
      local_2e40 = ray;
      local_2e38 = context;
LAB_003754fa:
      do {
        do {
          auVar105 = auVar147._0_16_;
          root.ptr = puVar96[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00376c7e;
          puVar96 = puVar96 + -1;
          pauVar97 = pauVar97 + -1;
          auVar109 = *pauVar97;
          auVar125 = vcmpps_avx(auVar109,local_2b20,1);
        } while ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar125 >> 0x7f,0) == '\0') &&
                   (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar125 >> 0xbf,0) == '\0') &&
                 (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar125[0x1f]);
        uVar92 = vmovmskps_avx(auVar125);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar92);
        if (local_2f30 < (uint)POPCOUNT(uVar92)) {
LAB_0037553a:
          auVar135 = ZEXT3264(auVar109);
          do {
            uVar86 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00376c7e;
              auVar109 = vcmpps_avx(local_2b20,auVar135._0_32_,6);
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0x7f,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0xbf,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0x1f] < '\0') {
                local_2e60 = (ulong)(uVar86 & 0xf) - 8;
                auVar109 = vcmpps_avx(auVar147._0_32_,auVar147._0_32_,0xf);
                auVar147 = ZEXT3264(auVar109);
                auVar105 = auVar109._0_16_;
                auVar133 = _local_2ea0;
                if (local_2e60 != 0) {
                  uVar83 = root.ptr & 0xfffffffffffffff0;
                  auVar135 = ZEXT3264(CONCAT428(local_2ea0._28_4_ ^ auVar109._28_4_,
                                                CONCAT424(local_2ea0._24_4_ ^ auVar109._24_4_,
                                                          CONCAT420(local_2ea0._20_4_ ^
                                                                    auVar109._20_4_,
                                                                    CONCAT416(local_2ea0._16_4_ ^
                                                                              auVar109._16_4_,
                                                                              CONCAT412(local_2ea0.
                                                                                        _12_4_ ^ 
                                                  auVar109._12_4_,
                                                  CONCAT48(local_2ea0._8_4_ ^ auVar109._8_4_,
                                                           CONCAT44(local_2ea0._4_4_ ^
                                                                    auVar109._4_4_,
                                                                    local_2ea0._0_4_ ^
                                                                    auVar109._0_4_))))))));
                  lVar89 = 0;
                  local_2f28 = pauVar97;
                  local_2f20 = puVar96;
                  do {
                    lVar84 = lVar89 * 0x90;
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = *(ulong *)(uVar83 + 0x20 + lVar84);
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = *(ulong *)(uVar83 + 0x24 + lVar84);
                    auVar104 = vpminub_avx(auVar105,auVar104);
                    auVar105 = vpcmpeqb_avx(auVar105,auVar104);
                    auVar104 = vpcmpeqd_avx(auVar104,auVar104);
                    auVar105 = vpmovzxbd_avx(auVar105 ^ auVar104);
                    auVar105 = vpslld_avx(auVar105 ^ auVar104,0x1f);
                    uVar86 = vmovmskps_avx(auVar105);
                    local_2e58 = lVar89;
                    if (uVar86 != 0) {
                      lVar89 = uVar83 + lVar84;
                      uVar92 = *(undefined4 *)(uVar83 + 0x80 + lVar84);
                      auVar115._4_4_ = uVar92;
                      auVar115._0_4_ = uVar92;
                      auVar115._8_4_ = uVar92;
                      auVar115._12_4_ = uVar92;
                      auVar115._16_4_ = uVar92;
                      auVar115._20_4_ = uVar92;
                      auVar115._24_4_ = uVar92;
                      auVar115._28_4_ = uVar92;
                      auVar109 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar115);
                      fVar205 = *(float *)(uVar83 + 0x84 + lVar84);
                      auVar147._0_4_ = fVar205 * auVar109._0_4_;
                      auVar147._4_4_ = fVar205 * auVar109._4_4_;
                      auVar147._8_4_ = fVar205 * auVar109._8_4_;
                      auVar147._12_4_ = fVar205 * auVar109._12_4_;
                      auVar147._16_4_ = fVar205 * auVar109._16_4_;
                      auVar147._20_4_ = fVar205 * auVar109._20_4_;
                      auVar147._28_36_ = in_ZMM13._28_36_;
                      auVar147._24_4_ = fVar205 * auVar109._24_4_;
                      in_ZMM13 = ZEXT3264(auVar147._0_32_);
                      uVar88 = (ulong)(uVar86 & 0xff);
                      local_2860 = auVar147._0_32_;
                      local_2e50 = lVar89;
                      do {
                        auVar109 = auVar135._0_32_;
                        lVar84 = 0;
                        if (uVar88 != 0) {
                          for (; (uVar88 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
                          }
                        }
                        auVar167._8_8_ = 0;
                        auVar167._0_8_ = *(ulong *)(lVar89 + 0x20);
                        auVar105 = vpmovzxbd_avx(auVar167);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar205 = *(float *)(lVar89 + 0x44);
                        fVar149 = *(float *)(lVar89 + 0x38);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar150 = local_2b00[lVar84];
                        auVar157._8_8_ = 0;
                        auVar157._0_8_ = *(ulong *)(lVar89 + 0x50);
                        auVar105 = vpmovzxbd_avx(auVar157);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar151 = *(float *)(lVar89 + 0x74);
                        fVar152 = *(float *)(lVar89 + 0x68);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar150)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar150)),0);
                        fVar153 = in_ZMM13._0_4_;
                        fVar154 = in_ZMM13._4_4_;
                        fVar177 = in_ZMM13._8_4_;
                        fVar178 = in_ZMM13._12_4_;
                        fVar179 = in_ZMM13._16_4_;
                        fVar180 = in_ZMM13._20_4_;
                        fVar181 = in_ZMM13._24_4_;
                        auVar116._0_4_ = fVar150 + fVar153 * auVar105._0_4_;
                        auVar116._4_4_ = fVar150 + fVar154 * auVar105._4_4_;
                        auVar116._8_4_ = fVar150 + fVar177 * auVar105._8_4_;
                        auVar116._12_4_ = fVar150 + fVar178 * auVar105._12_4_;
                        auVar116._16_4_ = fVar150 + fVar179 * auVar105._0_4_;
                        auVar116._20_4_ = fVar150 + fVar180 * auVar105._4_4_;
                        auVar116._24_4_ = fVar150 + fVar181 * auVar105._8_4_;
                        auVar116._28_4_ = fVar150 + auVar105._12_4_;
                        auVar158._8_8_ = 0;
                        auVar158._0_8_ = *(ulong *)(lVar89 + 0x24);
                        auVar105 = vpmovzxbd_avx(auVar158);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar205 = local_2b00[lVar84];
                        auVar137._8_8_ = 0;
                        auVar137._0_8_ = *(ulong *)(lVar89 + 0x54);
                        auVar105 = vpmovzxbd_avx(auVar137);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar205)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar205)),0);
                        auVar130._0_4_ = fVar205 + fVar153 * auVar105._0_4_;
                        auVar130._4_4_ = fVar205 + fVar154 * auVar105._4_4_;
                        auVar130._8_4_ = fVar205 + fVar177 * auVar105._8_4_;
                        auVar130._12_4_ = fVar205 + fVar178 * auVar105._12_4_;
                        auVar130._16_4_ = fVar205 + fVar179 * auVar105._0_4_;
                        auVar130._20_4_ = fVar205 + fVar180 * auVar105._4_4_;
                        auVar130._24_4_ = fVar205 + fVar181 * auVar105._8_4_;
                        auVar130._28_4_ = fVar205 + auVar105._12_4_;
                        auVar138._8_8_ = 0;
                        auVar138._0_8_ = *(ulong *)(lVar89 + 0x28);
                        auVar105 = vpmovzxbd_avx(auVar138);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar205 = *(float *)(lVar89 + 0x48);
                        fVar149 = *(float *)(lVar89 + 0x3c);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar150 = local_2b00[lVar84];
                        auVar184._8_8_ = 0;
                        auVar184._0_8_ = *(ulong *)(lVar89 + 0x58);
                        auVar105 = vpmovzxbd_avx(auVar184);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar151 = *(float *)(lVar89 + 0x78);
                        fVar152 = *(float *)(lVar89 + 0x6c);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar150)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar150)),0);
                        auVar140._0_4_ = fVar150 + fVar153 * auVar105._0_4_;
                        auVar140._4_4_ = fVar150 + fVar154 * auVar105._4_4_;
                        auVar140._8_4_ = fVar150 + fVar177 * auVar105._8_4_;
                        auVar140._12_4_ = fVar150 + fVar178 * auVar105._12_4_;
                        auVar140._16_4_ = fVar150 + fVar179 * auVar105._0_4_;
                        auVar140._20_4_ = fVar150 + fVar180 * auVar105._4_4_;
                        auVar140._24_4_ = fVar150 + fVar181 * auVar105._8_4_;
                        auVar140._28_4_ = fVar150 + auVar105._12_4_;
                        auVar185._8_8_ = 0;
                        auVar185._0_8_ = *(ulong *)(lVar89 + 0x2c);
                        auVar105 = vpmovzxbd_avx(auVar185);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar205 = local_2b00[lVar84];
                        auVar168._8_8_ = 0;
                        auVar168._0_8_ = *(ulong *)(lVar89 + 0x5c);
                        auVar105 = vpmovzxbd_avx(auVar168);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar205)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar205)),0);
                        auVar163._0_4_ = fVar205 + fVar153 * auVar105._0_4_;
                        auVar163._4_4_ = fVar205 + fVar154 * auVar105._4_4_;
                        auVar163._8_4_ = fVar205 + fVar177 * auVar105._8_4_;
                        auVar163._12_4_ = fVar205 + fVar178 * auVar105._12_4_;
                        auVar163._16_4_ = fVar205 + fVar179 * auVar105._0_4_;
                        auVar163._20_4_ = fVar205 + fVar180 * auVar105._4_4_;
                        auVar163._24_4_ = fVar205 + fVar181 * auVar105._8_4_;
                        auVar163._28_4_ = fVar205 + auVar105._12_4_;
                        auVar169._8_8_ = 0;
                        auVar169._0_8_ = *(ulong *)(lVar89 + 0x30);
                        auVar105 = vpmovzxbd_avx(auVar169);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar205 = *(float *)(lVar89 + 0x4c);
                        fVar149 = *(float *)(lVar89 + 0x40);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar150 = local_2b00[lVar84];
                        auVar208._8_8_ = 0;
                        auVar208._0_8_ = *(ulong *)(lVar89 + 0x60);
                        auVar105 = vpmovzxbd_avx(auVar208);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        fVar151 = *(float *)(lVar89 + 0x7c);
                        fVar152 = *(float *)(lVar89 + 0x70);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar150)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar150)),0);
                        auVar173._0_4_ = fVar150 + fVar153 * auVar105._0_4_;
                        auVar173._4_4_ = fVar150 + fVar154 * auVar105._4_4_;
                        auVar173._8_4_ = fVar150 + fVar177 * auVar105._8_4_;
                        auVar173._12_4_ = fVar150 + fVar178 * auVar105._12_4_;
                        auVar173._16_4_ = fVar150 + fVar179 * auVar105._0_4_;
                        auVar173._20_4_ = fVar150 + fVar180 * auVar105._4_4_;
                        auVar173._24_4_ = fVar150 + fVar181 * auVar105._8_4_;
                        auVar173._28_4_ = fVar150 + auVar105._12_4_;
                        auVar209._8_8_ = 0;
                        auVar209._0_8_ = *(ulong *)(lVar89 + 0x34);
                        auVar105 = vpmovzxbd_avx(auVar209);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_2b00[0] = fVar149 + fVar205 * auVar105._0_4_;
                        local_2b00[1] = fVar149 + fVar205 * auVar105._4_4_;
                        local_2b00[2] = fVar149 + fVar205 * auVar105._8_4_;
                        local_2b00[3] = fVar149 + fVar205 * auVar105._12_4_;
                        fVar205 = local_2b00[lVar84];
                        auVar198._8_8_ = 0;
                        auVar198._0_8_ = *(ulong *)(lVar89 + 100);
                        auVar105 = vpmovzxbd_avx(auVar198);
                        auVar105 = vcvtdq2ps_avx(auVar105);
                        local_29a0[0] = fVar152 + fVar151 * auVar105._0_4_;
                        local_29a0[1] = fVar152 + fVar151 * auVar105._4_4_;
                        local_29a0[2] = fVar152 + fVar151 * auVar105._8_4_;
                        local_29a0[3] = fVar152 + fVar151 * auVar105._12_4_;
                        auVar105 = vshufps_avx(ZEXT416((uint)(local_29a0[lVar84] - fVar205)),
                                               ZEXT416((uint)(local_29a0[lVar84] - fVar205)),0);
                        auVar192._0_4_ = fVar205 + fVar153 * auVar105._0_4_;
                        auVar192._4_4_ = fVar205 + fVar154 * auVar105._4_4_;
                        auVar192._8_4_ = fVar205 + fVar177 * auVar105._8_4_;
                        auVar192._12_4_ = fVar205 + fVar178 * auVar105._12_4_;
                        auVar192._16_4_ = fVar205 + fVar179 * auVar105._0_4_;
                        auVar192._20_4_ = fVar205 + fVar180 * auVar105._4_4_;
                        auVar192._24_4_ = fVar205 + fVar181 * auVar105._8_4_;
                        auVar192._28_4_ = fVar205 + auVar105._12_4_;
                        auVar76._8_8_ = local_2cc0._8_8_;
                        auVar76._0_8_ = local_2cc0._0_8_;
                        auVar76._16_8_ = local_2cc0._16_8_;
                        auVar76._24_8_ = local_2cc0._24_8_;
                        auVar78._8_8_ = local_2cc0._40_8_;
                        auVar78._0_8_ = local_2cc0._32_8_;
                        auVar78._16_8_ = local_2cc0._48_8_;
                        auVar78._24_8_ = local_2cc0._56_8_;
                        auVar80._8_8_ = local_2cc0._72_8_;
                        auVar80._0_8_ = local_2cc0._64_8_;
                        auVar80._16_8_ = local_2cc0._80_8_;
                        auVar80._24_8_ = local_2cc0._88_8_;
                        auVar125 = vsubps_avx(auVar116,auVar76);
                        auVar31._4_4_ = local_2c00._4_4_ * auVar125._4_4_;
                        auVar31._0_4_ = local_2c00._0_4_ * auVar125._0_4_;
                        auVar31._8_4_ = local_2c00._8_4_ * auVar125._8_4_;
                        auVar31._12_4_ = local_2c00._12_4_ * auVar125._12_4_;
                        auVar31._16_4_ = local_2c00._16_4_ * auVar125._16_4_;
                        auVar31._20_4_ = local_2c00._20_4_ * auVar125._20_4_;
                        auVar31._24_4_ = local_2c00._24_4_ * auVar125._24_4_;
                        auVar31._28_4_ = auVar125._28_4_;
                        auVar125 = vsubps_avx(auVar140,auVar78);
                        auVar144._4_4_ = (float)local_2be0._4_4_ * auVar125._4_4_;
                        auVar144._0_4_ = (float)local_2be0._0_4_ * auVar125._0_4_;
                        auVar144._8_4_ = fStack_2bd8 * auVar125._8_4_;
                        auVar144._12_4_ = fStack_2bd4 * auVar125._12_4_;
                        auVar144._16_4_ = fStack_2bd0 * auVar125._16_4_;
                        auVar144._20_4_ = fStack_2bcc * auVar125._20_4_;
                        auVar144._24_4_ = fStack_2bc8 * auVar125._24_4_;
                        auVar144._28_4_ = auVar125._28_4_;
                        auVar125 = vsubps_avx(auVar173,auVar80);
                        auVar32._4_4_ = (float)local_2bc0._4_4_ * auVar125._4_4_;
                        auVar32._0_4_ = (float)local_2bc0._0_4_ * auVar125._0_4_;
                        auVar32._8_4_ = fStack_2bb8 * auVar125._8_4_;
                        auVar32._12_4_ = fStack_2bb4 * auVar125._12_4_;
                        auVar32._16_4_ = fStack_2bb0 * auVar125._16_4_;
                        auVar32._20_4_ = fStack_2bac * auVar125._20_4_;
                        auVar32._24_4_ = fStack_2ba8 * auVar125._24_4_;
                        auVar32._28_4_ = auVar125._28_4_;
                        auVar125 = vsubps_avx(auVar130,auVar76);
                        auVar33._4_4_ = local_2c00._4_4_ * auVar125._4_4_;
                        auVar33._0_4_ = local_2c00._0_4_ * auVar125._0_4_;
                        auVar33._8_4_ = local_2c00._8_4_ * auVar125._8_4_;
                        auVar33._12_4_ = local_2c00._12_4_ * auVar125._12_4_;
                        auVar33._16_4_ = local_2c00._16_4_ * auVar125._16_4_;
                        auVar33._20_4_ = local_2c00._20_4_ * auVar125._20_4_;
                        auVar33._24_4_ = local_2c00._24_4_ * auVar125._24_4_;
                        auVar33._28_4_ = auVar125._28_4_;
                        auVar125 = vsubps_avx(auVar163,auVar78);
                        auVar34._4_4_ = (float)local_2be0._4_4_ * auVar125._4_4_;
                        auVar34._0_4_ = (float)local_2be0._0_4_ * auVar125._0_4_;
                        auVar34._8_4_ = fStack_2bd8 * auVar125._8_4_;
                        auVar34._12_4_ = fStack_2bd4 * auVar125._12_4_;
                        auVar34._16_4_ = fStack_2bd0 * auVar125._16_4_;
                        auVar34._20_4_ = fStack_2bcc * auVar125._20_4_;
                        auVar34._24_4_ = fStack_2bc8 * auVar125._24_4_;
                        auVar34._28_4_ = auVar125._28_4_;
                        auVar125 = vsubps_avx(auVar192,auVar80);
                        auVar35._4_4_ = (float)local_2bc0._4_4_ * auVar125._4_4_;
                        auVar35._0_4_ = (float)local_2bc0._0_4_ * auVar125._0_4_;
                        auVar35._8_4_ = fStack_2bb8 * auVar125._8_4_;
                        auVar35._12_4_ = fStack_2bb4 * auVar125._12_4_;
                        auVar35._16_4_ = fStack_2bb0 * auVar125._16_4_;
                        auVar35._20_4_ = fStack_2bac * auVar125._20_4_;
                        auVar35._24_4_ = fStack_2ba8 * auVar125._24_4_;
                        auVar35._28_4_ = auVar125._28_4_;
                        auVar125 = vminps_avx(auVar31,auVar33);
                        auVar160 = vminps_avx(auVar144,auVar34);
                        auVar125 = vmaxps_avx(auVar125,auVar160);
                        auVar160 = vminps_avx(auVar32,auVar35);
                        auVar125 = vmaxps_avx(auVar125,auVar160);
                        auVar36._4_4_ = auVar125._4_4_ * 0.99999964;
                        auVar36._0_4_ = auVar125._0_4_ * 0.99999964;
                        auVar36._8_4_ = auVar125._8_4_ * 0.99999964;
                        auVar36._12_4_ = auVar125._12_4_ * 0.99999964;
                        auVar36._16_4_ = auVar125._16_4_ * 0.99999964;
                        auVar36._20_4_ = auVar125._20_4_ * 0.99999964;
                        auVar36._24_4_ = auVar125._24_4_ * 0.99999964;
                        auVar36._28_4_ = auVar125._28_4_;
                        auVar125 = vmaxps_avx(auVar31,auVar33);
                        auVar160 = vmaxps_avx(auVar144,auVar34);
                        auVar160 = vminps_avx(auVar125,auVar160);
                        auVar125 = vmaxps_avx(auVar32,auVar35);
                        auVar125 = vminps_avx(auVar160,auVar125);
                        auVar37._4_4_ = auVar125._4_4_ * 1.0000004;
                        auVar37._0_4_ = auVar125._0_4_ * 1.0000004;
                        auVar37._8_4_ = auVar125._8_4_ * 1.0000004;
                        auVar37._12_4_ = auVar125._12_4_ * 1.0000004;
                        auVar37._16_4_ = auVar125._16_4_ * 1.0000004;
                        auVar37._20_4_ = auVar125._20_4_ * 1.0000004;
                        auVar37._24_4_ = auVar125._24_4_ * 1.0000004;
                        auVar37._28_4_ = auVar125._28_4_;
                        auVar125 = vmaxps_avx(auVar36,local_2b40);
                        auVar160 = vminps_avx(auVar37,local_2b20);
                        auVar125 = vcmpps_avx(auVar125,auVar160,2);
                        auVar125 = auVar109 & auVar125;
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0')
                              && (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar125 >> 0xbf,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar125[0x1f]) {
                          bVar102 = false;
                        }
                        else {
                          uVar1 = *(ushort *)(lVar89 + lVar84 * 8);
                          uVar86 = *(uint *)(lVar89 + 0x88);
                          uVar2 = *(uint *)(lVar89 + 4 + lVar84 * 8);
                          uVar82 = vmovmskps_avx(auVar109);
                          local_2ce0 = auVar109;
                          if (uVar82 != 0) {
                            local_2800 = auVar109;
                            uVar91 = (ulong)(uVar82 & 0xff);
                            local_2f0c = uVar1 & 0x7fff;
                            local_2f10 = (uint)*(ushort *)(lVar89 + 2 + lVar84 * 8);
                            local_2f14 = local_2f10 & 0x7fff;
                            local_2e30 = (ulong)(-1 < (short)uVar1);
                            auVar105 = vpshufd_avx(ZEXT416(local_2f0c),0);
                            auVar105 = vpaddd_avx(auVar105,_DAT_01fab9b0);
                            auVar104 = vpshufd_avx(ZEXT416(local_2f14),0);
                            auVar104 = vpaddd_avx(auVar104,_DAT_01fab9c0);
                            auVar117._16_16_ = auVar105;
                            auVar117._0_16_ = auVar105;
                            _local_2760 = vcvtdq2ps_avx(auVar117);
                            auVar118._16_16_ = auVar104;
                            auVar118._0_16_ = auVar104;
                            _local_2780 = vcvtdq2ps_avx(auVar118);
                            auVar105 = vpshufd_avx(ZEXT416(uVar86),0);
                            local_2820._16_16_ = auVar105;
                            local_2820._0_16_ = auVar105;
                            auVar105 = vpshufd_avx(ZEXT416(uVar2),0);
                            local_2840._16_16_ = auVar105;
                            local_2840._0_16_ = auVar105;
                            uVar93 = (ulong)uVar86;
                            pRVar100 = ray;
                            pRVar101 = context;
                            local_2e48 = uVar88;
                            local_2e28 = (ulong)uVar2;
                            local_2e20 = (ulong)uVar86;
                            do {
                              uVar88 = local_2e20;
                              context = local_2e38;
                              ray = local_2e40;
                              local_2e00._0_8_ = uVar91;
                              lVar89 = 0;
                              if (uVar91 != 0) {
                                for (; (uVar91 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
                                }
                              }
                              local_2da0._0_8_ = lVar89;
                              local_2e08 = pRVar101->scene;
                              pGVar94 = (local_2e08->geometries).items[uVar93].ptr;
                              local_2e10 = *(long *)&pGVar94->field_0x58;
                              auVar106._8_8_ = 0;
                              auVar106._0_4_ = (pGVar94->time_range).lower;
                              auVar106._4_4_ = (pGVar94->time_range).upper;
                              auVar105 = vshufps_avx(auVar106,auVar106,0);
                              auVar141._16_16_ = auVar105;
                              auVar141._0_16_ = auVar105;
                              fVar205 = pGVar94->fnumTimeSegments;
                              auVar109 = vsubps_avx(*(undefined1 (*) [32])(pRVar100 + 0xe0),auVar141
                                                   );
                              auVar104 = vshufps_avx(auVar106,auVar106,0x55);
                              auVar105 = vsubps_avx(auVar104,auVar105);
                              auVar119._16_16_ = auVar105;
                              auVar119._0_16_ = auVar105;
                              auVar109 = vdivps_avx(auVar109,auVar119);
                              local_2e18 = pGVar94[1].super_RefCount.refCounter.
                                           super___atomic_base<unsigned_long>._M_i * local_2e28;
                              auVar38._4_4_ = fVar205 * auVar109._4_4_;
                              auVar38._0_4_ = fVar205 * auVar109._0_4_;
                              auVar38._8_4_ = fVar205 * auVar109._8_4_;
                              auVar38._12_4_ = fVar205 * auVar109._12_4_;
                              auVar38._16_4_ = fVar205 * auVar109._16_4_;
                              auVar38._20_4_ = fVar205 * auVar109._20_4_;
                              auVar38._24_4_ = fVar205 * auVar109._24_4_;
                              auVar38._28_4_ = auVar109._28_4_;
                              auVar109 = vroundps_avx(auVar38,1);
                              auVar105 = vshufps_avx(ZEXT416((uint)(fVar205 + -1.0)),
                                                     ZEXT416((uint)(fVar205 + -1.0)),0);
                              auVar142._16_16_ = auVar105;
                              auVar142._0_16_ = auVar105;
                              auVar109 = vminps_avx(auVar109,auVar142);
                              auVar109 = vmaxps_avx(auVar109,_DAT_01faff00);
                              local_2640 = vsubps_avx(auVar38,auVar109);
                              local_2660 = vcvtps2dq_avx(auVar109);
                              uVar86 = *(uint *)(local_2e10 + 4 + local_2e18);
                              uVar91 = (ulong)uVar86;
                              uVar98 = (ulong)(uVar86 * local_2f14 +
                                              *(int *)(local_2e10 + local_2e18) + local_2f0c);
                              lVar3 = *(long *)&pGVar94[2].numPrimitives;
                              lVar90 = (long)*(int *)(local_2660 + lVar89 * 4) * 0x38;
                              lVar4 = *(long *)(lVar3 + lVar90);
                              lVar5 = *(long *)(lVar3 + 0x10 + lVar90);
                              lVar6 = *(long *)(lVar3 + 0x48 + lVar90);
                              auVar105 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar98);
                              auVar104 = *(undefined1 (*) [16])(lVar4 + (uVar98 + 1) * lVar5);
                              lVar84 = uVar98 + uVar91;
                              auVar155 = *(undefined1 (*) [16])(lVar4 + lVar84 * lVar5);
                              lVar99 = uVar98 + uVar91 + 1;
                              auVar167 = *(undefined1 (*) [16])(lVar4 + lVar99 * lVar5);
                              lVar85 = uVar98 + local_2e30 + 1;
                              auVar103 = *(undefined1 (*) [16])(lVar4 + lVar85 * lVar5);
                              lVar87 = local_2e30 + lVar99;
                              uVar93 = 0;
                              if (-1 < (short)local_2f10) {
                                uVar93 = uVar91;
                              }
                              auVar156 = *(undefined1 (*) [16])(lVar4 + lVar87 * lVar5);
                              auVar166 = *(undefined1 (*) [16])(lVar4 + (lVar84 + uVar93) * lVar5);
                              auVar183 = *(undefined1 (*) [16])(lVar4 + (lVar99 + uVar93) * lVar5);
                              auVar197 = *(undefined1 (*) [16])(lVar4 + lVar5 * (uVar93 + lVar87));
                              lVar3 = *(long *)(lVar3 + 0x38 + lVar90);
                              fVar205 = *(float *)(local_2640 + lVar89 * 4);
                              auVar207 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * uVar98),
                                                    auVar105);
                              auVar139._0_4_ = fVar205 * auVar207._0_4_ + auVar105._0_4_;
                              auVar139._4_4_ = fVar205 * auVar207._4_4_ + auVar105._4_4_;
                              auVar139._8_4_ = fVar205 * auVar207._8_4_ + auVar105._8_4_;
                              auVar139._12_4_ = fVar205 * auVar207._12_4_ + auVar105._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])
                                                     (lVar3 + lVar6 * (uVar98 + 1)),auVar104);
                              auVar242._0_4_ = fVar205 * auVar105._0_4_ + auVar104._0_4_;
                              auVar242._4_4_ = fVar205 * auVar105._4_4_ + auVar104._4_4_;
                              auVar242._8_4_ = fVar205 * auVar105._8_4_ + auVar104._8_4_;
                              auVar242._12_4_ = fVar205 * auVar105._12_4_ + auVar104._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar84),
                                                    auVar155);
                              auVar107._0_4_ = fVar205 * auVar105._0_4_ + auVar155._0_4_;
                              auVar107._4_4_ = fVar205 * auVar105._4_4_ + auVar155._4_4_;
                              auVar107._8_4_ = fVar205 * auVar105._8_4_ + auVar155._8_4_;
                              auVar107._12_4_ = fVar205 * auVar105._12_4_ + auVar155._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar99),
                                                    auVar167);
                              auVar122._0_4_ = fVar205 * auVar105._0_4_ + auVar167._0_4_;
                              auVar122._4_4_ = fVar205 * auVar105._4_4_ + auVar167._4_4_;
                              auVar122._8_4_ = fVar205 * auVar105._8_4_ + auVar167._8_4_;
                              auVar122._12_4_ = fVar205 * auVar105._12_4_ + auVar167._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar85),
                                                    auVar103);
                              auVar170._0_4_ = fVar205 * auVar105._0_4_ + auVar103._0_4_;
                              auVar170._4_4_ = fVar205 * auVar105._4_4_ + auVar103._4_4_;
                              auVar170._8_4_ = fVar205 * auVar105._8_4_ + auVar103._8_4_;
                              auVar170._12_4_ = fVar205 * auVar105._12_4_ + auVar103._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar87),
                                                    auVar156);
                              auVar186._0_4_ = fVar205 * auVar105._0_4_ + auVar156._0_4_;
                              auVar186._4_4_ = fVar205 * auVar105._4_4_ + auVar156._4_4_;
                              auVar186._8_4_ = fVar205 * auVar105._8_4_ + auVar156._8_4_;
                              auVar186._12_4_ = fVar205 * auVar105._12_4_ + auVar156._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])
                                                     (lVar3 + lVar6 * (lVar84 + uVar93)),auVar166);
                              auVar159._0_4_ = auVar166._0_4_ + fVar205 * auVar105._0_4_;
                              auVar159._4_4_ = auVar166._4_4_ + fVar205 * auVar105._4_4_;
                              auVar159._8_4_ = auVar166._8_4_ + fVar205 * auVar105._8_4_;
                              auVar159._12_4_ = auVar166._12_4_ + fVar205 * auVar105._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])
                                                     (lVar3 + lVar6 * (lVar99 + uVar93)),auVar183);
                              auVar199._0_4_ = auVar183._0_4_ + fVar205 * auVar105._0_4_;
                              auVar199._4_4_ = auVar183._4_4_ + fVar205 * auVar105._4_4_;
                              auVar199._8_4_ = auVar183._8_4_ + fVar205 * auVar105._8_4_;
                              auVar199._12_4_ = auVar183._12_4_ + fVar205 * auVar105._12_4_;
                              auVar105 = vsubps_avx(*(undefined1 (*) [16])
                                                     (lVar3 + (uVar93 + lVar87) * lVar6),auVar197);
                              auVar210._0_4_ = auVar197._0_4_ + fVar205 * auVar105._0_4_;
                              auVar210._4_4_ = auVar197._4_4_ + fVar205 * auVar105._4_4_;
                              auVar210._8_4_ = auVar197._8_4_ + fVar205 * auVar105._8_4_;
                              auVar210._12_4_ = auVar197._12_4_ + fVar205 * auVar105._12_4_;
                              auVar167 = vunpcklps_avx(auVar139,auVar122);
                              auVar105 = vunpckhps_avx(auVar139,auVar122);
                              auVar103 = vunpcklps_avx(auVar242,auVar107);
                              auVar104 = vunpckhps_avx(auVar242,auVar107);
                              auVar156 = vunpcklps_avx(auVar105,auVar104);
                              auVar166 = vunpcklps_avx(auVar167,auVar103);
                              auVar105 = vunpckhps_avx(auVar167,auVar103);
                              auVar103 = vunpcklps_avx(auVar242,auVar186);
                              auVar104 = vunpckhps_avx(auVar242,auVar186);
                              auVar155 = vunpcklps_avx(auVar170,auVar122);
                              auVar167 = vunpckhps_avx(auVar170,auVar122);
                              auVar183 = vunpcklps_avx(auVar104,auVar167);
                              auVar197 = vunpcklps_avx(auVar103,auVar155);
                              auVar104 = vunpckhps_avx(auVar103,auVar155);
                              auVar155 = vunpcklps_avx(auVar122,auVar210);
                              auVar167 = vunpckhps_avx(auVar122,auVar210);
                              auVar207 = vunpcklps_avx(auVar186,auVar199);
                              auVar103 = vunpckhps_avx(auVar186,auVar199);
                              auVar227 = vunpcklps_avx(auVar167,auVar103);
                              auVar137 = vunpcklps_avx(auVar155,auVar207);
                              auVar167 = vunpckhps_avx(auVar155,auVar207);
                              auVar207 = vunpcklps_avx(auVar107,auVar199);
                              auVar103 = vunpckhps_avx(auVar107,auVar199);
                              auVar138 = vunpcklps_avx(auVar122,auVar159);
                              auVar155 = vunpckhps_avx(auVar122,auVar159);
                              auVar155 = vunpcklps_avx(auVar103,auVar155);
                              auVar157 = vunpcklps_avx(auVar207,auVar138);
                              auVar103 = vunpckhps_avx(auVar207,auVar138);
                              auVar202._16_16_ = auVar137;
                              auVar202._0_16_ = auVar166;
                              auVar213._16_16_ = auVar167;
                              auVar213._0_16_ = auVar105;
                              auVar143._16_16_ = auVar227;
                              auVar143._0_16_ = auVar156;
                              auVar231._16_16_ = auVar197;
                              auVar231._0_16_ = auVar197;
                              auVar243._16_16_ = auVar104;
                              auVar243._0_16_ = auVar104;
                              auVar174._16_16_ = auVar183;
                              auVar174._0_16_ = auVar183;
                              auVar254._16_16_ = auVar157;
                              auVar254._0_16_ = auVar157;
                              auVar164._16_16_ = auVar103;
                              auVar164._0_16_ = auVar103;
                              auVar261._16_16_ = auVar155;
                              auVar261._0_16_ = auVar155;
                              uVar92 = *(undefined4 *)(local_2e40 + lVar89 * 4);
                              auVar265._4_4_ = uVar92;
                              auVar265._0_4_ = uVar92;
                              auVar265._8_4_ = uVar92;
                              auVar265._12_4_ = uVar92;
                              auVar265._16_4_ = uVar92;
                              auVar265._20_4_ = uVar92;
                              auVar265._24_4_ = uVar92;
                              auVar265._28_4_ = uVar92;
                              uVar92 = *(undefined4 *)(local_2e40 + lVar89 * 4 + 0x20);
                              auVar284._4_4_ = uVar92;
                              auVar284._0_4_ = uVar92;
                              auVar284._8_4_ = uVar92;
                              auVar284._12_4_ = uVar92;
                              auVar284._16_4_ = uVar92;
                              auVar284._20_4_ = uVar92;
                              auVar284._24_4_ = uVar92;
                              auVar284._28_4_ = uVar92;
                              uVar92 = *(undefined4 *)(local_2e40 + lVar89 * 4 + 0x40);
                              auVar286._4_4_ = uVar92;
                              auVar286._0_4_ = uVar92;
                              auVar286._8_4_ = uVar92;
                              auVar286._12_4_ = uVar92;
                              auVar286._16_4_ = uVar92;
                              auVar286._20_4_ = uVar92;
                              auVar286._24_4_ = uVar92;
                              auVar286._28_4_ = uVar92;
                              local_2de0 = vsubps_avx(auVar202,auVar265);
                              local_2d00 = vsubps_avx(auVar213,auVar284);
                              local_2d20 = vsubps_avx(auVar143,auVar286);
                              auVar109 = vsubps_avx(auVar231,auVar265);
                              auVar161 = vsubps_avx(auVar243,auVar284);
                              auVar125 = vsubps_avx(auVar174,auVar286);
                              auVar160 = vsubps_avx(auVar254,auVar265);
                              auVar171 = vsubps_avx(auVar164,auVar284);
                              auVar188 = vsubps_avx(auVar261,auVar286);
                              local_2680 = vsubps_avx(auVar160,local_2de0);
                              local_26a0 = vsubps_avx(auVar171,local_2d00);
                              local_26c0 = vsubps_avx(auVar188,local_2d20);
                              fVar149 = local_2d00._0_4_;
                              fVar205 = auVar171._0_4_ + fVar149;
                              fVar152 = local_2d00._4_4_;
                              fVar214 = auVar171._4_4_ + fVar152;
                              fVar177 = local_2d00._8_4_;
                              fVar216 = auVar171._8_4_ + fVar177;
                              fVar180 = local_2d00._12_4_;
                              fVar218 = auVar171._12_4_ + fVar180;
                              fVar8 = local_2d00._16_4_;
                              fVar220 = auVar171._16_4_ + fVar8;
                              fVar11 = local_2d00._20_4_;
                              fVar222 = auVar171._20_4_ + fVar11;
                              fVar14 = local_2d00._24_4_;
                              fVar224 = auVar171._24_4_ + fVar14;
                              fVar150 = local_2d20._0_4_;
                              fVar240 = auVar188._0_4_ + fVar150;
                              fVar153 = local_2d20._4_4_;
                              fVar245 = auVar188._4_4_ + fVar153;
                              fVar178 = local_2d20._8_4_;
                              fVar246 = auVar188._8_4_ + fVar178;
                              fVar181 = local_2d20._12_4_;
                              fVar247 = auVar188._12_4_ + fVar181;
                              fVar9 = local_2d20._16_4_;
                              fVar248 = auVar188._16_4_ + fVar9;
                              fVar12 = local_2d20._20_4_;
                              fVar249 = auVar188._20_4_ + fVar12;
                              fVar15 = local_2d20._24_4_;
                              fVar250 = auVar188._24_4_ + fVar15;
                              fVar241 = local_2d20._28_4_;
                              fVar251 = auVar188._28_4_ + fVar241;
                              fVar17 = local_26c0._0_4_;
                              fVar18 = local_26c0._4_4_;
                              auVar39._4_4_ = fVar214 * fVar18;
                              auVar39._0_4_ = fVar205 * fVar17;
                              fVar19 = local_26c0._8_4_;
                              auVar39._8_4_ = fVar216 * fVar19;
                              fVar20 = local_26c0._12_4_;
                              auVar39._12_4_ = fVar218 * fVar20;
                              fVar21 = local_26c0._16_4_;
                              auVar39._16_4_ = fVar220 * fVar21;
                              fVar136 = local_26c0._20_4_;
                              auVar39._20_4_ = fVar222 * fVar136;
                              fVar148 = local_26c0._24_4_;
                              auVar39._24_4_ = fVar224 * fVar148;
                              auVar39._28_4_ = auVar157._12_4_;
                              fVar293 = local_26a0._0_4_;
                              fVar295 = local_26a0._4_4_;
                              auVar40._4_4_ = fVar295 * fVar245;
                              auVar40._0_4_ = fVar293 * fVar240;
                              fVar297 = local_26a0._8_4_;
                              auVar40._8_4_ = fVar297 * fVar246;
                              fVar299 = local_26a0._12_4_;
                              auVar40._12_4_ = fVar299 * fVar247;
                              fVar301 = local_26a0._16_4_;
                              auVar40._16_4_ = fVar301 * fVar248;
                              fVar303 = local_26a0._20_4_;
                              auVar40._20_4_ = fVar303 * fVar249;
                              fVar305 = local_26a0._24_4_;
                              auVar40._24_4_ = fVar305 * fVar250;
                              auVar40._28_4_ = auVar155._12_4_;
                              auVar189 = vsubps_avx(auVar40,auVar39);
                              fVar151 = local_2de0._0_4_;
                              fVar252 = auVar160._0_4_ + fVar151;
                              fVar154 = local_2de0._4_4_;
                              fVar255 = auVar160._4_4_ + fVar154;
                              fVar179 = local_2de0._8_4_;
                              fVar256 = auVar160._8_4_ + fVar179;
                              fVar182 = local_2de0._12_4_;
                              fVar257 = auVar160._12_4_ + fVar182;
                              fVar10 = local_2de0._16_4_;
                              fVar258 = auVar160._16_4_ + fVar10;
                              fVar13 = local_2de0._20_4_;
                              fVar259 = auVar160._20_4_ + fVar13;
                              fVar16 = local_2de0._24_4_;
                              fVar260 = auVar160._24_4_ + fVar16;
                              fVar262 = local_2680._0_4_;
                              fVar266 = local_2680._4_4_;
                              auVar41._4_4_ = fVar266 * fVar245;
                              auVar41._0_4_ = fVar262 * fVar240;
                              fVar269 = local_2680._8_4_;
                              auVar41._8_4_ = fVar269 * fVar246;
                              fVar272 = local_2680._12_4_;
                              auVar41._12_4_ = fVar272 * fVar247;
                              fVar275 = local_2680._16_4_;
                              auVar41._16_4_ = fVar275 * fVar248;
                              fVar278 = local_2680._20_4_;
                              auVar41._20_4_ = fVar278 * fVar249;
                              fVar281 = local_2680._24_4_;
                              auVar41._24_4_ = fVar281 * fVar250;
                              auVar41._28_4_ = fVar251;
                              auVar211 = local_26c0;
                              auVar42._4_4_ = fVar255 * fVar18;
                              auVar42._0_4_ = fVar252 * fVar17;
                              auVar42._8_4_ = fVar256 * fVar19;
                              auVar42._12_4_ = fVar257 * fVar20;
                              auVar42._16_4_ = fVar258 * fVar21;
                              auVar42._20_4_ = fVar259 * fVar136;
                              auVar42._24_4_ = fVar260 * fVar148;
                              auVar42._28_4_ = auVar155._12_4_;
                              auVar190 = vsubps_avx(auVar42,auVar41);
                              auVar43._4_4_ = fVar255 * fVar295;
                              auVar43._0_4_ = fVar252 * fVar293;
                              auVar43._8_4_ = fVar256 * fVar297;
                              auVar43._12_4_ = fVar257 * fVar299;
                              auVar43._16_4_ = fVar258 * fVar301;
                              auVar43._20_4_ = fVar259 * fVar303;
                              auVar43._24_4_ = fVar260 * fVar305;
                              auVar43._28_4_ = fVar251;
                              auVar44._4_4_ = fVar266 * fVar214;
                              auVar44._0_4_ = fVar262 * fVar205;
                              auVar44._8_4_ = fVar269 * fVar216;
                              auVar44._12_4_ = fVar272 * fVar218;
                              auVar44._16_4_ = fVar275 * fVar220;
                              auVar44._20_4_ = fVar278 * fVar222;
                              auVar44._24_4_ = fVar281 * fVar224;
                              auVar44._28_4_ = auVar171._28_4_ + local_2d00._28_4_;
                              auVar200 = vsubps_avx(auVar44,auVar43);
                              local_2ee0._4_4_ = *(undefined4 *)(local_2e40 + lVar89 * 4 + 0xa0);
                              fVar205 = *(float *)(local_2e40 + lVar89 * 4 + 0xc0);
                              local_2f00._4_4_ = fVar205;
                              local_2f00._0_4_ = fVar205;
                              local_2f00._8_4_ = fVar205;
                              local_2f00._12_4_ = fVar205;
                              local_2f00._16_4_ = fVar205;
                              local_2f00._20_4_ = fVar205;
                              local_2f00._24_4_ = fVar205;
                              local_2f00._28_4_ = fVar205;
                              local_2dc0 = *(float *)(local_2e40 + lVar89 * 4 + 0x80);
                              local_2720._0_4_ =
                                   auVar189._0_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._0_4_ +
                                   auVar200._0_4_ * fVar205;
                              local_2720._4_4_ =
                                   auVar189._4_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._4_4_ +
                                   auVar200._4_4_ * fVar205;
                              local_2720._8_4_ =
                                   auVar189._8_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._8_4_ +
                                   auVar200._8_4_ * fVar205;
                              local_2720._12_4_ =
                                   auVar189._12_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._12_4_ +
                                   auVar200._12_4_ * fVar205;
                              local_2720._16_4_ =
                                   auVar189._16_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._16_4_ +
                                   auVar200._16_4_ * fVar205;
                              local_2720._20_4_ =
                                   auVar189._20_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._20_4_ +
                                   auVar200._20_4_ * fVar205;
                              local_2720._24_4_ =
                                   auVar189._24_4_ * local_2dc0 +
                                   (float)local_2ee0._4_4_ * auVar190._24_4_ +
                                   auVar200._24_4_ * fVar205;
                              local_2720._28_4_ =
                                   auVar189._28_4_ + auVar190._28_4_ + auVar200._28_4_;
                              local_26e0 = vsubps_avx(local_2d00,auVar161);
                              local_2700 = vsubps_avx(local_2d20,auVar125);
                              fVar246 = auVar161._0_4_ + fVar149;
                              fVar247 = auVar161._4_4_ + fVar152;
                              fVar248 = auVar161._8_4_ + fVar177;
                              fVar249 = auVar161._12_4_ + fVar180;
                              fVar250 = auVar161._16_4_ + fVar8;
                              fVar251 = auVar161._20_4_ + fVar11;
                              fVar252 = auVar161._24_4_ + fVar14;
                              fVar216 = fVar150 + auVar125._0_4_;
                              fVar218 = fVar153 + auVar125._4_4_;
                              fVar220 = fVar178 + auVar125._8_4_;
                              fVar222 = fVar181 + auVar125._12_4_;
                              fVar224 = fVar9 + auVar125._16_4_;
                              fVar240 = fVar12 + auVar125._20_4_;
                              fVar245 = fVar15 + auVar125._24_4_;
                              fVar214 = auVar125._28_4_;
                              fVar263 = local_2700._0_4_;
                              fVar267 = local_2700._4_4_;
                              auVar45._4_4_ = fVar267 * fVar247;
                              auVar45._0_4_ = fVar263 * fVar246;
                              fVar270 = local_2700._8_4_;
                              auVar45._8_4_ = fVar270 * fVar248;
                              fVar273 = local_2700._12_4_;
                              auVar45._12_4_ = fVar273 * fVar249;
                              fVar276 = local_2700._16_4_;
                              auVar45._16_4_ = fVar276 * fVar250;
                              fVar279 = local_2700._20_4_;
                              auVar45._20_4_ = fVar279 * fVar251;
                              fVar282 = local_2700._24_4_;
                              auVar45._24_4_ = fVar282 * fVar252;
                              auVar45._28_4_ = auVar190._28_4_;
                              fVar294 = local_26e0._0_4_;
                              fVar296 = local_26e0._4_4_;
                              auVar46._4_4_ = fVar296 * fVar218;
                              auVar46._0_4_ = fVar294 * fVar216;
                              fVar298 = local_26e0._8_4_;
                              auVar46._8_4_ = fVar298 * fVar220;
                              fVar300 = local_26e0._12_4_;
                              auVar46._12_4_ = fVar300 * fVar222;
                              fVar302 = local_26e0._16_4_;
                              auVar46._16_4_ = fVar302 * fVar224;
                              fVar304 = local_26e0._20_4_;
                              auVar46._20_4_ = fVar304 * fVar240;
                              fVar306 = local_26e0._24_4_;
                              auVar46._24_4_ = fVar306 * fVar245;
                              auVar46._28_4_ = fVar241;
                              auVar189 = vsubps_avx(auVar46,auVar45);
                              auVar190 = vsubps_avx(local_2de0,auVar109);
                              fVar285 = auVar190._0_4_;
                              fVar287 = auVar190._4_4_;
                              auVar47._4_4_ = fVar287 * fVar218;
                              auVar47._0_4_ = fVar285 * fVar216;
                              fVar288 = auVar190._8_4_;
                              auVar47._8_4_ = fVar288 * fVar220;
                              fVar289 = auVar190._12_4_;
                              auVar47._12_4_ = fVar289 * fVar222;
                              fVar290 = auVar190._16_4_;
                              auVar47._16_4_ = fVar290 * fVar224;
                              fVar291 = auVar190._20_4_;
                              auVar47._20_4_ = fVar291 * fVar240;
                              fVar292 = auVar190._24_4_;
                              auVar47._24_4_ = fVar292 * fVar245;
                              auVar47._28_4_ = fVar241 + fVar214;
                              fVar241 = fVar151 + auVar109._0_4_;
                              fVar216 = fVar154 + auVar109._4_4_;
                              fVar218 = fVar179 + auVar109._8_4_;
                              fVar220 = fVar182 + auVar109._12_4_;
                              fVar222 = fVar10 + auVar109._16_4_;
                              fVar224 = fVar13 + auVar109._20_4_;
                              fVar240 = fVar16 + auVar109._24_4_;
                              auVar48._4_4_ = fVar216 * fVar267;
                              auVar48._0_4_ = fVar241 * fVar263;
                              auVar48._8_4_ = fVar218 * fVar270;
                              auVar48._12_4_ = fVar220 * fVar273;
                              auVar48._16_4_ = fVar222 * fVar276;
                              auVar48._20_4_ = fVar224 * fVar279;
                              auVar48._24_4_ = fVar240 * fVar282;
                              auVar48._28_4_ = local_2700._28_4_;
                              auVar190 = vsubps_avx(auVar48,auVar47);
                              auVar49._4_4_ = fVar216 * fVar296;
                              auVar49._0_4_ = fVar241 * fVar294;
                              auVar49._8_4_ = fVar218 * fVar298;
                              auVar49._12_4_ = fVar220 * fVar300;
                              auVar49._16_4_ = fVar222 * fVar302;
                              auVar49._20_4_ = fVar224 * fVar304;
                              auVar49._24_4_ = fVar240 * fVar306;
                              auVar49._28_4_ = local_2de0._28_4_ + auVar109._28_4_;
                              auVar50._4_4_ = fVar287 * fVar247;
                              auVar50._0_4_ = fVar285 * fVar246;
                              auVar50._8_4_ = fVar288 * fVar248;
                              auVar50._12_4_ = fVar289 * fVar249;
                              auVar50._16_4_ = fVar290 * fVar250;
                              auVar50._20_4_ = fVar291 * fVar251;
                              auVar50._24_4_ = fVar292 * fVar252;
                              auVar50._28_4_ = auVar161._28_4_ + local_2d00._28_4_;
                              auVar200 = vsubps_avx(auVar50,auVar49);
                              fVar196 = auVar200._28_4_ + auVar190._28_4_;
                              local_2740._0_4_ =
                                   local_2dc0 * auVar189._0_4_ +
                                   auVar200._0_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._0_4_;
                              local_2740._4_4_ =
                                   local_2dc0 * auVar189._4_4_ +
                                   auVar200._4_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._4_4_;
                              local_2740._8_4_ =
                                   local_2dc0 * auVar189._8_4_ +
                                   auVar200._8_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._8_4_;
                              local_2740._12_4_ =
                                   local_2dc0 * auVar189._12_4_ +
                                   auVar200._12_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._12_4_;
                              local_2740._16_4_ =
                                   local_2dc0 * auVar189._16_4_ +
                                   auVar200._16_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._16_4_;
                              local_2740._20_4_ =
                                   local_2dc0 * auVar189._20_4_ +
                                   auVar200._20_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._20_4_;
                              local_2740._24_4_ =
                                   local_2dc0 * auVar189._24_4_ +
                                   auVar200._24_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar190._24_4_;
                              local_2740._28_4_ = auVar189._28_4_ + fVar196;
                              auVar189 = vsubps_avx(auVar109,auVar160);
                              fVar252 = auVar109._0_4_ + auVar160._0_4_;
                              fVar255 = auVar109._4_4_ + auVar160._4_4_;
                              fVar256 = auVar109._8_4_ + auVar160._8_4_;
                              fVar257 = auVar109._12_4_ + auVar160._12_4_;
                              fVar258 = auVar109._16_4_ + auVar160._16_4_;
                              fVar259 = auVar109._20_4_ + auVar160._20_4_;
                              fVar260 = auVar109._24_4_ + auVar160._24_4_;
                              auVar190 = vsubps_avx(auVar161,auVar171);
                              fVar245 = auVar161._0_4_ + auVar171._0_4_;
                              fVar246 = auVar161._4_4_ + auVar171._4_4_;
                              fVar247 = auVar161._8_4_ + auVar171._8_4_;
                              fVar248 = auVar161._12_4_ + auVar171._12_4_;
                              fVar249 = auVar161._16_4_ + auVar171._16_4_;
                              fVar250 = auVar161._20_4_ + auVar171._20_4_;
                              fVar251 = auVar161._24_4_ + auVar171._24_4_;
                              auVar200 = vsubps_avx(auVar125,auVar188);
                              fVar241 = auVar125._0_4_ + auVar188._0_4_;
                              fVar216 = auVar125._4_4_ + auVar188._4_4_;
                              fVar218 = auVar125._8_4_ + auVar188._8_4_;
                              fVar220 = auVar125._12_4_ + auVar188._12_4_;
                              fVar222 = auVar125._16_4_ + auVar188._16_4_;
                              fVar224 = auVar125._20_4_ + auVar188._20_4_;
                              fVar240 = auVar125._24_4_ + auVar188._24_4_;
                              fVar226 = auVar200._0_4_;
                              fVar234 = auVar200._4_4_;
                              auVar51._4_4_ = fVar234 * fVar246;
                              auVar51._0_4_ = fVar226 * fVar245;
                              fVar235 = auVar200._8_4_;
                              auVar51._8_4_ = fVar235 * fVar247;
                              fVar236 = auVar200._12_4_;
                              auVar51._12_4_ = fVar236 * fVar248;
                              fVar237 = auVar200._16_4_;
                              auVar51._16_4_ = fVar237 * fVar249;
                              fVar238 = auVar200._20_4_;
                              auVar51._20_4_ = fVar238 * fVar250;
                              fVar239 = auVar200._24_4_;
                              auVar51._24_4_ = fVar239 * fVar251;
                              auVar51._28_4_ = fVar214;
                              fVar264 = auVar190._0_4_;
                              fVar268 = auVar190._4_4_;
                              auVar52._4_4_ = fVar268 * fVar216;
                              auVar52._0_4_ = fVar264 * fVar241;
                              fVar271 = auVar190._8_4_;
                              auVar52._8_4_ = fVar271 * fVar218;
                              fVar274 = auVar190._12_4_;
                              auVar52._12_4_ = fVar274 * fVar220;
                              fVar277 = auVar190._16_4_;
                              auVar52._16_4_ = fVar277 * fVar222;
                              fVar280 = auVar190._20_4_;
                              auVar52._20_4_ = fVar280 * fVar224;
                              fVar283 = auVar190._24_4_;
                              auVar52._24_4_ = fVar283 * fVar240;
                              auVar52._28_4_ = fVar196;
                              auVar125 = vsubps_avx(auVar52,auVar51);
                              fVar206 = auVar189._0_4_;
                              fVar215 = auVar189._4_4_;
                              auVar53._4_4_ = fVar215 * fVar216;
                              auVar53._0_4_ = fVar206 * fVar241;
                              fVar217 = auVar189._8_4_;
                              auVar53._8_4_ = fVar217 * fVar218;
                              fVar219 = auVar189._12_4_;
                              auVar53._12_4_ = fVar219 * fVar220;
                              fVar221 = auVar189._16_4_;
                              auVar53._16_4_ = fVar221 * fVar222;
                              fVar223 = auVar189._20_4_;
                              auVar53._20_4_ = fVar223 * fVar224;
                              fVar225 = auVar189._24_4_;
                              auVar53._24_4_ = fVar225 * fVar240;
                              auVar53._28_4_ = fVar214 + auVar188._28_4_;
                              auVar54._4_4_ = fVar234 * fVar255;
                              auVar54._0_4_ = fVar226 * fVar252;
                              auVar54._8_4_ = fVar235 * fVar256;
                              auVar54._12_4_ = fVar236 * fVar257;
                              auVar54._16_4_ = fVar237 * fVar258;
                              auVar54._20_4_ = fVar238 * fVar259;
                              auVar54._24_4_ = fVar239 * fVar260;
                              auVar54._28_4_ = fVar196;
                              auVar188 = vsubps_avx(auVar54,auVar53);
                              auVar55._4_4_ = fVar268 * fVar255;
                              auVar55._0_4_ = fVar264 * fVar252;
                              auVar55._8_4_ = fVar271 * fVar256;
                              auVar55._12_4_ = fVar274 * fVar257;
                              auVar55._16_4_ = fVar277 * fVar258;
                              auVar55._20_4_ = fVar280 * fVar259;
                              auVar55._24_4_ = fVar283 * fVar260;
                              auVar55._28_4_ = auVar109._28_4_ + auVar160._28_4_;
                              auVar56._4_4_ = fVar215 * fVar246;
                              auVar56._0_4_ = fVar206 * fVar245;
                              auVar56._8_4_ = fVar217 * fVar247;
                              auVar56._12_4_ = fVar219 * fVar248;
                              auVar56._16_4_ = fVar221 * fVar249;
                              auVar56._20_4_ = fVar223 * fVar250;
                              auVar56._24_4_ = fVar225 * fVar251;
                              auVar56._28_4_ = auVar161._28_4_ + auVar171._28_4_;
                              auVar109 = vsubps_avx(auVar56,auVar55);
                              local_2ee0._0_4_ = local_2ee0._4_4_;
                              fStack_2ed8 = (float)local_2ee0._4_4_;
                              fStack_2ed4 = (float)local_2ee0._4_4_;
                              fStack_2ed0 = (float)local_2ee0._4_4_;
                              fStack_2ecc = (float)local_2ee0._4_4_;
                              fStack_2ec8 = (float)local_2ee0._4_4_;
                              fStack_2ec4 = (float)local_2ee0._4_4_;
                              auVar131._0_4_ =
                                   local_2dc0 * auVar125._0_4_ +
                                   auVar109._0_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._0_4_;
                              auVar131._4_4_ =
                                   local_2dc0 * auVar125._4_4_ +
                                   auVar109._4_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._4_4_;
                              auVar131._8_4_ =
                                   local_2dc0 * auVar125._8_4_ +
                                   auVar109._8_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._8_4_;
                              auVar131._12_4_ =
                                   local_2dc0 * auVar125._12_4_ +
                                   auVar109._12_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._12_4_;
                              auVar131._16_4_ =
                                   local_2dc0 * auVar125._16_4_ +
                                   auVar109._16_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._16_4_;
                              auVar131._20_4_ =
                                   local_2dc0 * auVar125._20_4_ +
                                   auVar109._20_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._20_4_;
                              auVar131._24_4_ =
                                   local_2dc0 * auVar125._24_4_ +
                                   auVar109._24_4_ * fVar205 +
                                   (float)local_2ee0._4_4_ * auVar188._24_4_;
                              auVar131._28_4_ = auVar109._28_4_ + auVar109._28_4_ + auVar188._28_4_;
                              local_2ec0._0_4_ =
                                   auVar131._0_4_ + local_2720._0_4_ + local_2740._0_4_;
                              local_2ec0._4_4_ =
                                   auVar131._4_4_ + local_2720._4_4_ + local_2740._4_4_;
                              local_2ec0._8_4_ =
                                   auVar131._8_4_ + local_2720._8_4_ + local_2740._8_4_;
                              local_2ec0._12_4_ =
                                   auVar131._12_4_ + local_2720._12_4_ + local_2740._12_4_;
                              local_2ec0._16_4_ =
                                   auVar131._16_4_ + local_2720._16_4_ + local_2740._16_4_;
                              local_2ec0._20_4_ =
                                   auVar131._20_4_ + local_2720._20_4_ + local_2740._20_4_;
                              local_2ec0._24_4_ =
                                   auVar131._24_4_ + local_2720._24_4_ + local_2740._24_4_;
                              local_2ec0._28_4_ =
                                   auVar131._28_4_ + local_2720._28_4_ + local_2740._28_4_;
                              auVar109 = vminps_avx(local_2720,local_2740);
                              auVar109 = vminps_avx(auVar109,auVar131);
                              auVar175._8_4_ = 0x7fffffff;
                              auVar175._0_8_ = 0x7fffffff7fffffff;
                              auVar175._12_4_ = 0x7fffffff;
                              auVar175._16_4_ = 0x7fffffff;
                              auVar175._20_4_ = 0x7fffffff;
                              auVar175._24_4_ = 0x7fffffff;
                              auVar175._28_4_ = 0x7fffffff;
                              local_27a0 = vandps_avx(local_2ec0,auVar175);
                              fVar241 = local_27a0._0_4_ * 1.1920929e-07;
                              fVar214 = local_27a0._4_4_ * 1.1920929e-07;
                              auVar57._4_4_ = fVar214;
                              auVar57._0_4_ = fVar241;
                              fVar216 = local_27a0._8_4_ * 1.1920929e-07;
                              auVar57._8_4_ = fVar216;
                              fVar218 = local_27a0._12_4_ * 1.1920929e-07;
                              auVar57._12_4_ = fVar218;
                              fVar220 = local_27a0._16_4_ * 1.1920929e-07;
                              auVar57._16_4_ = fVar220;
                              fVar222 = local_27a0._20_4_ * 1.1920929e-07;
                              auVar57._20_4_ = fVar222;
                              fVar224 = local_27a0._24_4_ * 1.1920929e-07;
                              auVar57._24_4_ = fVar224;
                              auVar57._28_4_ = 0x34000000;
                              auVar193._0_8_ = CONCAT44(fVar214,fVar241) ^ 0x8000000080000000;
                              auVar193._8_4_ = -fVar216;
                              auVar193._12_4_ = -fVar218;
                              auVar193._16_4_ = -fVar220;
                              auVar193._20_4_ = -fVar222;
                              auVar193._24_4_ = -fVar224;
                              auVar193._28_4_ = 0xb4000000;
                              auVar109 = vcmpps_avx(auVar109,auVar193,5);
                              auVar160 = vmaxps_avx(local_2720,local_2740);
                              auVar125 = vmaxps_avx(auVar160,auVar131);
                              auVar125 = vcmpps_avx(auVar125,auVar57,2);
                              auVar109 = vorps_avx(auVar109,auVar125);
                              auVar144 = local_2f00;
                              fStack_2dbc = local_2dc0;
                              fStack_2db8 = local_2dc0;
                              fStack_2db4 = local_2dc0;
                              fStack_2db0 = local_2dc0;
                              fStack_2dac = local_2dc0;
                              fStack_2da8 = local_2dc0;
                              fStack_2da4 = local_2dc0;
                              local_26c0 = auVar211;
                              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar109 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                                    || (auVar109 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar109 >> 0xbf,0) != '\0')
                                  || (auVar109 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar109[0x1f] < '\0') {
                                auVar58._4_4_ = fVar296 * fVar18;
                                auVar58._0_4_ = fVar294 * fVar17;
                                auVar58._8_4_ = fVar298 * fVar19;
                                auVar58._12_4_ = fVar300 * fVar20;
                                auVar58._16_4_ = fVar302 * fVar21;
                                auVar58._20_4_ = fVar304 * fVar136;
                                auVar58._24_4_ = fVar306 * fVar148;
                                auVar58._28_4_ = auVar125._28_4_;
                                auVar59._4_4_ = fVar267 * fVar295;
                                auVar59._0_4_ = fVar263 * fVar293;
                                auVar59._8_4_ = fVar270 * fVar297;
                                auVar59._12_4_ = fVar273 * fVar299;
                                auVar59._16_4_ = fVar276 * fVar301;
                                auVar59._20_4_ = fVar279 * fVar303;
                                auVar59._24_4_ = fVar282 * fVar305;
                                auVar59._28_4_ = 0x34000000;
                                auVar161 = vsubps_avx(auVar59,auVar58);
                                auVar60._4_4_ = fVar268 * fVar267;
                                auVar60._0_4_ = fVar264 * fVar263;
                                auVar60._8_4_ = fVar271 * fVar270;
                                auVar60._12_4_ = fVar274 * fVar273;
                                auVar60._16_4_ = fVar277 * fVar276;
                                auVar60._20_4_ = fVar280 * fVar279;
                                auVar60._24_4_ = fVar283 * fVar282;
                                auVar60._28_4_ = auVar160._28_4_;
                                auVar61._4_4_ = fVar296 * fVar234;
                                auVar61._0_4_ = fVar294 * fVar226;
                                auVar61._8_4_ = fVar298 * fVar235;
                                auVar61._12_4_ = fVar300 * fVar236;
                                auVar61._16_4_ = fVar302 * fVar237;
                                auVar61._20_4_ = fVar304 * fVar238;
                                auVar61._24_4_ = fVar306 * fVar239;
                                auVar61._28_4_ = local_2740._28_4_;
                                auVar188 = vsubps_avx(auVar61,auVar60);
                                auVar244._8_4_ = 0x7fffffff;
                                auVar244._0_8_ = 0x7fffffff7fffffff;
                                auVar244._12_4_ = 0x7fffffff;
                                auVar244._16_4_ = 0x7fffffff;
                                auVar244._20_4_ = 0x7fffffff;
                                auVar244._24_4_ = 0x7fffffff;
                                auVar244._28_4_ = 0x7fffffff;
                                auVar125 = vandps_avx(auVar244,auVar58);
                                auVar160 = vandps_avx(auVar244,auVar60);
                                auVar125 = vcmpps_avx(auVar125,auVar160,1);
                                auVar171 = vblendvps_avx(auVar188,auVar161,auVar125);
                                auVar62._4_4_ = fVar287 * fVar234;
                                auVar62._0_4_ = fVar285 * fVar226;
                                auVar62._8_4_ = fVar288 * fVar235;
                                auVar62._12_4_ = fVar289 * fVar236;
                                auVar62._16_4_ = fVar290 * fVar237;
                                auVar62._20_4_ = fVar291 * fVar238;
                                auVar62._24_4_ = fVar292 * fVar239;
                                auVar62._28_4_ = auVar161._28_4_;
                                auVar63._4_4_ = fVar287 * fVar18;
                                auVar63._0_4_ = fVar285 * fVar17;
                                auVar63._8_4_ = fVar288 * fVar19;
                                auVar63._12_4_ = fVar289 * fVar20;
                                auVar63._16_4_ = fVar290 * fVar21;
                                auVar63._20_4_ = fVar291 * fVar136;
                                auVar63._24_4_ = fVar292 * fVar148;
                                auVar63._28_4_ = auVar160._28_4_;
                                auVar64._4_4_ = fVar266 * fVar267;
                                auVar64._0_4_ = fVar262 * fVar263;
                                auVar64._8_4_ = fVar269 * fVar270;
                                auVar64._12_4_ = fVar272 * fVar273;
                                auVar64._16_4_ = fVar275 * fVar276;
                                auVar64._20_4_ = fVar278 * fVar279;
                                auVar64._24_4_ = fVar281 * fVar282;
                                auVar64._28_4_ = auVar188._28_4_;
                                auVar188 = vsubps_avx(auVar63,auVar64);
                                auVar65._4_4_ = fVar267 * fVar215;
                                auVar65._0_4_ = fVar263 * fVar206;
                                auVar65._8_4_ = fVar270 * fVar217;
                                auVar65._12_4_ = fVar273 * fVar219;
                                auVar65._16_4_ = fVar276 * fVar221;
                                auVar65._20_4_ = fVar279 * fVar223;
                                auVar65._24_4_ = fVar282 * fVar225;
                                auVar65._28_4_ = auVar200._28_4_;
                                auVar161 = vsubps_avx(auVar65,auVar62);
                                auVar125 = vandps_avx(auVar244,auVar64);
                                auVar160 = vandps_avx(auVar244,auVar62);
                                auVar160 = vcmpps_avx(auVar125,auVar160,1);
                                auVar161 = vblendvps_avx(auVar161,auVar188,auVar160);
                                auVar66._4_4_ = fVar296 * fVar215;
                                auVar66._0_4_ = fVar294 * fVar206;
                                auVar66._8_4_ = fVar298 * fVar217;
                                auVar66._12_4_ = fVar300 * fVar219;
                                auVar66._16_4_ = fVar302 * fVar221;
                                auVar66._20_4_ = fVar304 * fVar223;
                                auVar66._24_4_ = fVar306 * fVar225;
                                auVar66._28_4_ = auVar160._28_4_;
                                auVar67._4_4_ = fVar266 * fVar296;
                                auVar67._0_4_ = fVar262 * fVar294;
                                auVar67._8_4_ = fVar269 * fVar298;
                                auVar67._12_4_ = fVar272 * fVar300;
                                auVar67._16_4_ = fVar275 * fVar302;
                                auVar67._20_4_ = fVar278 * fVar304;
                                auVar67._24_4_ = fVar281 * fVar306;
                                auVar67._28_4_ = auVar188._28_4_;
                                auVar68._4_4_ = fVar287 * fVar295;
                                auVar68._0_4_ = fVar285 * fVar293;
                                auVar68._8_4_ = fVar288 * fVar297;
                                auVar68._12_4_ = fVar289 * fVar299;
                                auVar68._16_4_ = fVar290 * fVar301;
                                auVar68._20_4_ = fVar291 * fVar303;
                                auVar68._24_4_ = fVar292 * fVar305;
                                auVar68._28_4_ = auVar125._28_4_;
                                auVar69._4_4_ = fVar287 * fVar268;
                                auVar69._0_4_ = fVar285 * fVar264;
                                auVar69._8_4_ = fVar288 * fVar271;
                                auVar69._12_4_ = fVar289 * fVar274;
                                auVar69._16_4_ = fVar290 * fVar277;
                                auVar69._20_4_ = fVar291 * fVar280;
                                auVar69._24_4_ = fVar292 * fVar283;
                                auVar69._28_4_ = local_26c0._28_4_;
                                auVar188 = vsubps_avx(auVar67,auVar68);
                                auVar200 = vsubps_avx(auVar69,auVar66);
                                auVar125 = vandps_avx(auVar244,auVar68);
                                auVar160 = vandps_avx(auVar244,auVar66);
                                auVar160 = vcmpps_avx(auVar125,auVar160,1);
                                auVar144 = vblendvps_avx(auVar200,auVar188,auVar160);
                                auVar105 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
                                fVar136 = auVar144._0_4_;
                                fVar148 = auVar144._4_4_;
                                fVar216 = auVar144._8_4_;
                                fVar218 = auVar144._12_4_;
                                fVar220 = auVar144._16_4_;
                                fVar222 = auVar144._20_4_;
                                fVar224 = auVar144._24_4_;
                                fVar251 = auVar161._0_4_;
                                fVar252 = auVar161._4_4_;
                                fVar255 = auVar161._8_4_;
                                fVar256 = auVar161._12_4_;
                                fVar257 = auVar161._16_4_;
                                fVar258 = auVar161._20_4_;
                                fVar259 = auVar161._24_4_;
                                fVar241 = auVar171._0_4_;
                                fVar214 = auVar171._4_4_;
                                fVar17 = auVar171._8_4_;
                                fVar18 = auVar171._12_4_;
                                fVar19 = auVar171._16_4_;
                                fVar20 = auVar171._20_4_;
                                fVar21 = auVar171._24_4_;
                                fVar240 = local_2dc0 * fVar241 +
                                          fVar136 * fVar205 + fVar251 * (float)local_2ee0._4_4_;
                                fVar245 = local_2dc0 * fVar214 +
                                          fVar148 * fVar205 + fVar252 * (float)local_2ee0._4_4_;
                                fVar246 = local_2dc0 * fVar17 +
                                          fVar216 * fVar205 + fVar255 * (float)local_2ee0._4_4_;
                                fVar247 = local_2dc0 * fVar18 +
                                          fVar218 * fVar205 + fVar256 * (float)local_2ee0._4_4_;
                                fVar248 = local_2dc0 * fVar19 +
                                          fVar220 * fVar205 + fVar257 * (float)local_2ee0._4_4_;
                                fVar249 = local_2dc0 * fVar20 +
                                          fVar222 * fVar205 + fVar258 * (float)local_2ee0._4_4_;
                                fVar205 = local_2dc0 * fVar21 +
                                          fVar224 * fVar205 + fVar259 * (float)local_2ee0._4_4_;
                                fVar250 = auVar109._28_4_ + 0.0 + 0.0;
                                auVar165._0_4_ = fVar240 + fVar240;
                                auVar165._4_4_ = fVar245 + fVar245;
                                auVar165._8_4_ = fVar246 + fVar246;
                                auVar165._12_4_ = fVar247 + fVar247;
                                auVar165._16_4_ = fVar248 + fVar248;
                                auVar165._20_4_ = fVar249 + fVar249;
                                auVar165._24_4_ = fVar205 + fVar205;
                                auVar165._28_4_ = fVar250 + fVar250;
                                fVar240 = fVar241 * fVar151 + fVar136 * fVar150 + fVar251 * fVar149;
                                fVar245 = fVar214 * fVar154 + fVar148 * fVar153 + fVar252 * fVar152;
                                fVar177 = fVar17 * fVar179 + fVar216 * fVar178 + fVar255 * fVar177;
                                fVar178 = fVar18 * fVar182 + fVar218 * fVar181 + fVar256 * fVar180;
                                fVar179 = fVar19 * fVar10 + fVar220 * fVar9 + fVar257 * fVar8;
                                fVar180 = fVar20 * fVar13 + fVar222 * fVar12 + fVar258 * fVar11;
                                fVar181 = fVar21 * fVar16 + fVar224 * fVar15 + fVar259 * fVar14;
                                fVar182 = auVar125._28_4_ + auVar125._28_4_ + 0.0;
                                auVar109 = vrcpps_avx(auVar165);
                                fVar205 = auVar109._0_4_;
                                fVar149 = auVar109._4_4_;
                                auVar70._4_4_ = auVar165._4_4_ * fVar149;
                                auVar70._0_4_ = auVar165._0_4_ * fVar205;
                                fVar150 = auVar109._8_4_;
                                auVar70._8_4_ = auVar165._8_4_ * fVar150;
                                fVar151 = auVar109._12_4_;
                                auVar70._12_4_ = auVar165._12_4_ * fVar151;
                                fVar152 = auVar109._16_4_;
                                auVar70._16_4_ = auVar165._16_4_ * fVar152;
                                fVar153 = auVar109._20_4_;
                                auVar70._20_4_ = auVar165._20_4_ * fVar153;
                                fVar154 = auVar109._24_4_;
                                auVar70._24_4_ = auVar165._24_4_ * fVar154;
                                auVar70._28_4_ = auVar189._28_4_;
                                auVar232._8_4_ = 0x3f800000;
                                auVar232._0_8_ = 0x3f8000003f800000;
                                auVar232._12_4_ = 0x3f800000;
                                auVar232._16_4_ = 0x3f800000;
                                auVar232._20_4_ = 0x3f800000;
                                auVar232._24_4_ = 0x3f800000;
                                auVar232._28_4_ = 0x3f800000;
                                auVar109 = vsubps_avx(auVar232,auVar70);
                                auVar71._4_4_ =
                                     (fVar245 + fVar245) * (fVar149 + fVar149 * auVar109._4_4_);
                                auVar71._0_4_ =
                                     (fVar240 + fVar240) * (fVar205 + fVar205 * auVar109._0_4_);
                                auVar71._8_4_ =
                                     (fVar177 + fVar177) * (fVar150 + fVar150 * auVar109._8_4_);
                                auVar71._12_4_ =
                                     (fVar178 + fVar178) * (fVar151 + fVar151 * auVar109._12_4_);
                                auVar71._16_4_ =
                                     (fVar179 + fVar179) * (fVar152 + fVar152 * auVar109._16_4_);
                                auVar71._20_4_ =
                                     (fVar180 + fVar180) * (fVar153 + fVar153 * auVar109._20_4_);
                                auVar71._24_4_ =
                                     (fVar181 + fVar181) * (fVar154 + fVar154 * auVar109._24_4_);
                                auVar71._28_4_ = fVar182 + fVar182;
                                uVar92 = *(undefined4 *)(local_2e40 + lVar89 * 4 + 0x60);
                                auVar203._4_4_ = uVar92;
                                auVar203._0_4_ = uVar92;
                                auVar203._8_4_ = uVar92;
                                auVar203._12_4_ = uVar92;
                                auVar203._16_4_ = uVar92;
                                auVar203._20_4_ = uVar92;
                                auVar203._24_4_ = uVar92;
                                auVar203._28_4_ = uVar92;
                                auVar109 = vcmpps_avx(auVar203,auVar71,2);
                                uVar92 = *(undefined4 *)(local_2e40 + lVar89 * 4 + 0x100);
                                auVar233._4_4_ = uVar92;
                                auVar233._0_4_ = uVar92;
                                auVar233._8_4_ = uVar92;
                                auVar233._12_4_ = uVar92;
                                auVar233._16_4_ = uVar92;
                                auVar233._20_4_ = uVar92;
                                auVar233._24_4_ = uVar92;
                                auVar233._28_4_ = uVar92;
                                auVar147 = ZEXT3264(auVar233);
                                auVar125 = vcmpps_avx(auVar71,auVar233,2);
                                auVar109 = vandps_avx(auVar125,auVar109);
                                auVar104 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
                                auVar105 = vpand_avx(auVar104,auVar105);
                                auVar104 = vpmovsxwd_avx(auVar105);
                                auVar167 = vpshufd_avx(auVar105,0xee);
                                auVar167 = vpmovsxwd_avx(auVar167);
                                auVar204._16_16_ = auVar167;
                                auVar204._0_16_ = auVar104;
                                auVar161 = local_2ec0;
                                if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar204 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar204 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar204 >> 0x7f,0) != '\0'
                                       ) || (auVar204 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB161(auVar167 >> 0x3f,0) != '\0') ||
                                    (auVar204 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar167[0xf] < '\0') {
                                  auVar109 = vcmpps_avx(auVar165,_DAT_01faff00,4);
                                  auVar104 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
                                  auVar105 = vpand_avx(auVar105,auVar104);
                                  auVar104 = vpmovsxwd_avx(auVar105);
                                  auVar167 = vpunpckhwd_avx(auVar105,auVar105);
                                  auVar194._16_16_ = auVar167;
                                  auVar194._0_16_ = auVar104;
                                  if ((((((((auVar194 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar194 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar194 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar194 >> 0x7f,0) != '\0') ||
                                        (auVar194 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB161(auVar167 >> 0x3f,0) != '\0'
                                       ) || (auVar194 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar167[0xf] < '\0') {
                                    local_2ac0 = local_2ec0;
                                    local_2aa0 = &local_2f31;
                                    local_2a80 = auVar194;
                                    local_2a20 = auVar71;
                                    auVar109 = vsubps_avx(local_2ec0,local_2740);
                                    auVar109 = vblendvps_avx(local_2720,auVar109,local_27c0);
                                    auVar125 = vsubps_avx(local_2ec0,local_2720);
                                    uStack_29e4 = auVar171._28_4_;
                                    local_2a00[0] = (float)local_27e0._0_4_ * fVar241;
                                    local_2a00[1] = (float)local_27e0._4_4_ * fVar214;
                                    local_2a00[2] = fStack_27d8 * fVar17;
                                    local_2a00[3] = fStack_27d4 * fVar18;
                                    fStack_29f0 = fStack_27d0 * fVar19;
                                    fStack_29ec = fStack_27cc * fVar20;
                                    fStack_29e8 = fStack_27c8 * fVar21;
                                    local_29e0[0] = fVar251 * (float)local_27e0._0_4_;
                                    local_29e0[1] = fVar252 * (float)local_27e0._4_4_;
                                    local_29e0[2] = fVar255 * fStack_27d8;
                                    local_29e0[3] = fVar256 * fStack_27d4;
                                    fStack_29d0 = fVar257 * fStack_27d0;
                                    fStack_29cc = fVar258 * fStack_27cc;
                                    fStack_29c8 = fVar259 * fStack_27c8;
                                    uStack_29c4 = uStack_29e4;
                                    local_29c0[0] = (float)local_27e0._0_4_ * fVar136;
                                    local_29c0[1] = (float)local_27e0._4_4_ * fVar148;
                                    local_29c0[2] = fStack_27d8 * fVar216;
                                    local_29c0[3] = fStack_27d4 * fVar218;
                                    fStack_29b0 = fStack_27d0 * fVar220;
                                    fStack_29ac = fStack_27cc * fVar222;
                                    fStack_29a8 = fStack_27c8 * fVar224;
                                    uStack_29a4 = uStack_29e4;
                                    auVar123._0_4_ =
                                         (float)(int)(*(ushort *)(local_2e10 + 8 + local_2e18) - 1);
                                    auVar123._4_12_ = auVar190._4_12_;
                                    auVar125 = vblendvps_avx(local_2740,auVar125,local_27c0);
                                    auVar104 = vrcpss_avx(auVar123,auVar123);
                                    auVar187._0_4_ =
                                         (float)(int)(*(ushort *)(local_2e10 + 10 + local_2e18) - 1)
                                    ;
                                    auVar187._4_12_ = auVar190._4_12_;
                                    auVar167 = vrcpss_avx(auVar187,auVar187);
                                    auVar104 = ZEXT416((uint)(auVar104._0_4_ *
                                                             (2.0 - auVar104._0_4_ * auVar123._0_4_)
                                                             ));
                                    auVar104 = vshufps_avx(auVar104,auVar104,0);
                                    local_2b00[0] =
                                         (local_2ec0._0_4_ * (float)local_2760._0_4_ +
                                         auVar109._0_4_) * auVar104._0_4_;
                                    local_2b00[1] =
                                         (local_2ec0._4_4_ * (float)local_2760._4_4_ +
                                         auVar109._4_4_) * auVar104._4_4_;
                                    local_2b00[2] =
                                         (local_2ec0._8_4_ * fStack_2758 + auVar109._8_4_) *
                                         auVar104._8_4_;
                                    fStack_2ae4 = auVar104._12_4_;
                                    local_2b00[3] =
                                         (local_2ec0._12_4_ * fStack_2754 + auVar109._12_4_) *
                                         fStack_2ae4;
                                    fStack_2af0 = (local_2ec0._16_4_ * fStack_2750 + auVar109._16_4_
                                                  ) * auVar104._0_4_;
                                    fStack_2aec = (local_2ec0._20_4_ * fStack_274c + auVar109._20_4_
                                                  ) * auVar104._4_4_;
                                    fStack_2ae8 = (local_2ec0._24_4_ * fStack_2748 + auVar109._24_4_
                                                  ) * auVar104._8_4_;
                                    auVar104 = ZEXT416((uint)(auVar167._0_4_ *
                                                             (2.0 - auVar167._0_4_ * auVar187._0_4_)
                                                             ));
                                    auVar104 = vshufps_avx(auVar104,auVar104,0);
                                    fVar205 = (local_2ec0._0_4_ * (float)local_2780._0_4_ +
                                              auVar125._0_4_) * auVar104._0_4_;
                                    fVar149 = (local_2ec0._4_4_ * (float)local_2780._4_4_ +
                                              auVar125._4_4_) * auVar104._4_4_;
                                    auVar144._4_4_ = fVar149;
                                    auVar144._0_4_ = fVar205;
                                    fVar150 = (local_2ec0._8_4_ * fStack_2778 + auVar125._8_4_) *
                                              auVar104._8_4_;
                                    auVar144._8_4_ = fVar150;
                                    fVar151 = (local_2ec0._12_4_ * fStack_2774 + auVar125._12_4_) *
                                              auVar104._12_4_;
                                    auVar144._12_4_ = fVar151;
                                    fVar152 = (local_2ec0._16_4_ * fStack_2770 + auVar125._16_4_) *
                                              auVar104._0_4_;
                                    auVar144._16_4_ = fVar152;
                                    fVar153 = (local_2ec0._20_4_ * fStack_276c + auVar125._20_4_) *
                                              auVar104._4_4_;
                                    auVar144._20_4_ = fVar153;
                                    fVar154 = (local_2ec0._24_4_ * fStack_2768 + auVar125._24_4_) *
                                              auVar104._8_4_;
                                    auVar144._24_4_ = fVar154;
                                    auVar144._28_4_ = auVar109._28_4_ + 0.0 + auVar125._28_4_;
                                    local_2ae0 = auVar144;
                                    pGVar94 = (local_2e08->geometries).items[local_2e20].ptr;
                                    if ((pGVar94->mask & *(uint *)(local_2e40 + lVar89 * 4 + 0x120))
                                        != 0) {
                                      if ((local_2e38->args->filter == (RTCFilterFunctionN)0x0) &&
                                         (pGVar94->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00376736:
                                        *(undefined4 *)(local_2ce0 + lVar89 * 4) = 0;
                                        auVar161 = local_2ec0;
                                      }
                                      else {
                                        auVar109 = vrcpps_avx(local_2ec0);
                                        fVar177 = auVar109._0_4_;
                                        fVar178 = auVar109._4_4_;
                                        auVar72._4_4_ = local_2ec0._4_4_ * fVar178;
                                        auVar72._0_4_ = local_2ec0._0_4_ * fVar177;
                                        fVar179 = auVar109._8_4_;
                                        auVar72._8_4_ = local_2ec0._8_4_ * fVar179;
                                        fVar180 = auVar109._12_4_;
                                        auVar72._12_4_ = local_2ec0._12_4_ * fVar180;
                                        fVar181 = auVar109._16_4_;
                                        auVar72._16_4_ = local_2ec0._16_4_ * fVar181;
                                        fVar182 = auVar109._20_4_;
                                        auVar72._20_4_ = local_2ec0._20_4_ * fVar182;
                                        fVar8 = auVar109._24_4_;
                                        auVar72._24_4_ = local_2ec0._24_4_ * fVar8;
                                        auVar72._28_4_ = local_2ec0._28_4_;
                                        auVar195._8_4_ = 0x3f800000;
                                        auVar195._0_8_ = 0x3f8000003f800000;
                                        auVar195._12_4_ = 0x3f800000;
                                        auVar195._16_4_ = 0x3f800000;
                                        auVar195._20_4_ = 0x3f800000;
                                        auVar195._24_4_ = 0x3f800000;
                                        auVar195._28_4_ = 0x3f800000;
                                        auVar125 = vsubps_avx(auVar195,auVar72);
                                        auVar120._0_4_ = fVar177 + fVar177 * auVar125._0_4_;
                                        auVar120._4_4_ = fVar178 + fVar178 * auVar125._4_4_;
                                        auVar120._8_4_ = fVar179 + fVar179 * auVar125._8_4_;
                                        auVar120._12_4_ = fVar180 + fVar180 * auVar125._12_4_;
                                        auVar120._16_4_ = fVar181 + fVar181 * auVar125._16_4_;
                                        auVar120._20_4_ = fVar182 + fVar182 * auVar125._20_4_;
                                        auVar120._24_4_ = fVar8 + fVar8 * auVar125._24_4_;
                                        auVar120._28_4_ = auVar109._28_4_ + auVar125._28_4_;
                                        auVar176._8_4_ = 0x219392ef;
                                        auVar176._0_8_ = 0x219392ef219392ef;
                                        auVar176._12_4_ = 0x219392ef;
                                        auVar176._16_4_ = 0x219392ef;
                                        auVar176._20_4_ = 0x219392ef;
                                        auVar176._24_4_ = 0x219392ef;
                                        auVar176._28_4_ = 0x219392ef;
                                        auVar109 = vcmpps_avx(local_27a0,auVar176,5);
                                        auVar109 = vandps_avx(auVar109,auVar120);
                                        auVar73._4_4_ = local_2b00[1] * auVar109._4_4_;
                                        auVar73._0_4_ = local_2b00[0] * auVar109._0_4_;
                                        auVar73._8_4_ = local_2b00[2] * auVar109._8_4_;
                                        auVar73._12_4_ = local_2b00[3] * auVar109._12_4_;
                                        auVar73._16_4_ = fStack_2af0 * auVar109._16_4_;
                                        auVar73._20_4_ = fStack_2aec * auVar109._20_4_;
                                        auVar73._24_4_ = fStack_2ae8 * auVar109._24_4_;
                                        auVar73._28_4_ = fStack_2ae4;
                                        local_2a60 = vminps_avx(auVar73,auVar195);
                                        auVar74._4_4_ = fVar149 * auVar109._4_4_;
                                        auVar74._0_4_ = fVar205 * auVar109._0_4_;
                                        auVar74._8_4_ = fVar150 * auVar109._8_4_;
                                        auVar74._12_4_ = fVar151 * auVar109._12_4_;
                                        auVar74._16_4_ = fVar152 * auVar109._16_4_;
                                        auVar74._20_4_ = fVar153 * auVar109._20_4_;
                                        auVar74._24_4_ = fVar154 * auVar109._24_4_;
                                        auVar74._28_4_ = auVar109._28_4_;
                                        local_2a40 = vminps_avx(auVar74,auVar195);
                                        auVar105 = vpacksswb_avx(auVar105,auVar105);
                                        bVar22 = SUB161(auVar105 >> 7,0) & 1 |
                                                 (SUB161(auVar105 >> 0xf,0) & 1) << 1 |
                                                 (SUB161(auVar105 >> 0x17,0) & 1) << 2 |
                                                 (SUB161(auVar105 >> 0x1f,0) & 1) << 3 |
                                                 (SUB161(auVar105 >> 0x27,0) & 1) << 4 |
                                                 (SUB161(auVar105 >> 0x2f,0) & 1) << 5 |
                                                 (SUB161(auVar105 >> 0x37,0) & 1) << 6 |
                                                 SUB161(auVar105 >> 0x3f,0) << 7;
                                        auVar95 = (undefined1  [8])(ulong)bVar22;
                                        uVar93 = 0;
                                        if (auVar95 != (undefined1  [8])0x0) {
                                          for (; (bVar22 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
                                          }
                                        }
                                        if (bVar22 != 0) {
                                          uVar86 = 1 << ((byte)lVar89 & 0x1f);
                                          lVar84 = (long)((int)uVar86 >> 4) * 0x10;
                                          local_2de0._16_8_ =
                                               *(undefined8 *)(mm_lookupmask_ps + lVar84 + 0x10);
                                          local_2de0._24_8_ =
                                               *(undefined8 *)(mm_lookupmask_ps + lVar84 + 0x18);
                                          local_2ec0 = ZEXT1632(*(undefined1 (*) [16])
                                                                 (mm_lookupmask_ps +
                                                                 ((uVar86 & 0xf) << 4)));
                                          fStack_2db0 = (float)local_2de0._16_8_;
                                          fStack_2dac = (float)((ulong)local_2de0._16_8_ >> 0x20);
                                          fStack_2da8 = (float)local_2de0._24_8_;
                                          fStack_2da4 = (float)((ulong)local_2de0._24_8_ >> 0x20);
                                          local_2de0._0_16_ =
                                               *(undefined1 (*) [16])
                                                (mm_lookupmask_ps + ((uVar86 & 0xf) << 4));
                                          local_2d20._0_8_ = pGVar94;
                                          local_2d00 = auVar233;
                                          do {
                                            local_2940 = *(undefined4 *)(local_2a60 + uVar93 * 4);
                                            local_2920 = *(undefined4 *)(local_2a40 + uVar93 * 4);
                                            *(float *)(ray + lVar89 * 4 + 0x100) =
                                                 local_2a00[uVar93 - 8];
                                            local_29a0[0] = local_2a00[uVar93];
                                            local_2980 = local_29e0[uVar93];
                                            fVar205 = local_29c0[uVar93];
                                            local_2960._4_4_ = fVar205;
                                            local_2960._0_4_ = fVar205;
                                            local_2960._8_4_ = fVar205;
                                            local_2960._12_4_ = fVar205;
                                            local_2960._16_4_ = fVar205;
                                            local_2960._20_4_ = fVar205;
                                            local_2960._24_4_ = fVar205;
                                            local_2960._28_4_ = fVar205;
                                            local_2d50.context = context->user;
                                            local_29a0[1] = local_29a0[0];
                                            local_29a0[2] = local_29a0[0];
                                            local_29a0[3] = local_29a0[0];
                                            fStack_2990 = local_29a0[0];
                                            fStack_298c = local_29a0[0];
                                            fStack_2988 = local_29a0[0];
                                            fStack_2984 = local_29a0[0];
                                            fStack_297c = local_2980;
                                            fStack_2978 = local_2980;
                                            fStack_2974 = local_2980;
                                            fStack_2970 = local_2980;
                                            fStack_296c = local_2980;
                                            fStack_2968 = local_2980;
                                            fStack_2964 = local_2980;
                                            uStack_293c = local_2940;
                                            uStack_2938 = local_2940;
                                            uStack_2934 = local_2940;
                                            uStack_2930 = local_2940;
                                            uStack_292c = local_2940;
                                            uStack_2928 = local_2940;
                                            uStack_2924 = local_2940;
                                            uStack_291c = local_2920;
                                            uStack_2918 = local_2920;
                                            uStack_2914 = local_2920;
                                            uStack_2910 = local_2920;
                                            uStack_290c = local_2920;
                                            uStack_2908 = local_2920;
                                            uStack_2904 = local_2920;
                                            local_2900 = local_2840._0_8_;
                                            uStack_28f8 = local_2840._8_8_;
                                            uStack_28f0 = local_2840._16_8_;
                                            uStack_28e8 = local_2840._24_8_;
                                            local_28e0 = local_2820;
                                            vcmpps_avx(local_2820,local_2820,0xf);
                                            local_28c0._4_4_ = (local_2d50.context)->instID[0];
                                            local_28c0._0_4_ = local_28c0._4_4_;
                                            local_28c0._8_4_ = local_28c0._4_4_;
                                            local_28c0._12_4_ = local_28c0._4_4_;
                                            local_28c0._16_4_ = local_28c0._4_4_;
                                            local_28c0._20_4_ = local_28c0._4_4_;
                                            local_28c0._24_4_ = local_28c0._4_4_;
                                            local_28c0._28_4_ = local_28c0._4_4_;
                                            local_28a0._4_4_ = (local_2d50.context)->instPrimID[0];
                                            local_28a0._0_4_ = local_28a0._4_4_;
                                            local_28a0._8_4_ = local_28a0._4_4_;
                                            local_28a0._12_4_ = local_28a0._4_4_;
                                            local_28a0._16_4_ = local_28a0._4_4_;
                                            local_28a0._20_4_ = local_28a0._4_4_;
                                            local_28a0._24_4_ = local_28a0._4_4_;
                                            local_28a0._28_4_ = local_28a0._4_4_;
                                            local_2d80 = local_2de0._0_8_;
                                            uStack_2d78 = local_2de0._8_8_;
                                            uStack_2d70 = local_2de0._16_8_;
                                            uStack_2d68 = local_2de0._24_8_;
                                            local_2d50.valid = (int *)&local_2d80;
                                            local_2d50.geometryUserPtr = pGVar94->userPtr;
                                            local_2d50.ray = (RTCRayN *)ray;
                                            local_2d50.hit = (RTCHitN *)local_29a0;
                                            local_2d50.N = 8;
                                            auVar108._4_4_ = fStack_2dbc;
                                            auVar108._0_4_ = local_2dc0;
                                            auVar108._8_4_ = fStack_2db8;
                                            auVar108._12_4_ = fStack_2db4;
                                            auVar124 = local_2ec0._0_16_;
                                            if (pGVar94->occlusionFilterN != (RTCFilterFunctionN)0x0
                                               ) {
                                              local_2ee0 = auVar95;
                                              local_2f00._0_8_ = uVar93;
                                              (*pGVar94->occlusionFilterN)(&local_2d50);
                                              auVar147 = ZEXT3264(local_2d00);
                                              auVar124._8_8_ = uStack_2d78;
                                              auVar124._0_8_ = local_2d80;
                                              auVar108._8_8_ = uStack_2d68;
                                              auVar108._0_8_ = uStack_2d70;
                                              pGVar94 = (Geometry *)local_2d20._0_8_;
                                              auVar95 = local_2ee0;
                                              uVar93 = local_2f00._0_8_;
                                            }
                                            auVar105 = vpcmpeqd_avx(auVar124,ZEXT816(0) << 0x40);
                                            auVar104 = vpcmpeqd_avx(auVar108,ZEXT816(0) << 0x40);
                                            auVar144._16_16_ = auVar104;
                                            auVar144._0_16_ = auVar105;
                                            auVar109 = vcmpps_avx(ZEXT1632(auVar104),
                                                                  ZEXT1632(auVar104),0xf);
                                            auVar125 = auVar109 & ~auVar144;
                                            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar125 >> 0x3f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   SUB321(auVar125 >> 0x7f,0) == '\0') &&
                                                  (auVar125 & (undefined1  [32])0x100000000) ==
                                                  (undefined1  [32])0x0) &&
                                                 SUB321(auVar125 >> 0xbf,0) == '\0') &&
                                                (auVar125 & (undefined1  [32])0x100000000) ==
                                                (undefined1  [32])0x0) && -1 < auVar125[0x1f]) {
                                              auVar121._0_4_ = auVar105._0_4_ ^ auVar109._0_4_;
                                              auVar121._4_4_ = auVar105._4_4_ ^ auVar109._4_4_;
                                              auVar121._8_4_ = auVar105._8_4_ ^ auVar109._8_4_;
                                              auVar121._12_4_ = auVar105._12_4_ ^ auVar109._12_4_;
                                              auVar121._16_4_ = auVar104._0_4_ ^ auVar109._16_4_;
                                              auVar121._20_4_ = auVar104._4_4_ ^ auVar109._20_4_;
                                              auVar121._24_4_ = auVar104._8_4_ ^ auVar109._24_4_;
                                              auVar121._28_4_ = auVar104._12_4_ ^ auVar109._28_4_;
                                            }
                                            else {
                                              p_Var7 = context->args->filter;
                                              if (p_Var7 == (RTCFilterFunctionN)0x0) {
                                                auVar109 = vcmpps_avx(auVar144,auVar144,0xf);
                                              }
                                              else {
                                                auVar109 = vcmpps_avx(auVar144,auVar144,0xf);
                                                if (((context->args->flags &
                                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                                   (((pGVar94->field_8).field_0x2 & 0x40) != 0)) {
                                                  local_2ee0 = auVar95;
                                                  local_2f00._0_8_ = uVar93;
                                                  auVar109 = ZEXT1632(auVar109._0_16_);
                                                  (*p_Var7)(&local_2d50);
                                                  auVar147 = ZEXT3264(local_2d00);
                                                  auVar109 = vcmpps_avx(auVar109,auVar109,0xf);
                                                  auVar124._8_8_ = uStack_2d78;
                                                  auVar124._0_8_ = local_2d80;
                                                  auVar108._8_8_ = uStack_2d68;
                                                  auVar108._0_8_ = uStack_2d70;
                                                  pGVar94 = (Geometry *)local_2d20._0_8_;
                                                  auVar95 = local_2ee0;
                                                  uVar93 = local_2f00._0_8_;
                                                }
                                              }
                                              auVar105 = vpcmpeqd_avx(auVar124,ZEXT816(0) << 0x40);
                                              auVar104 = vpcmpeqd_avx(auVar108,ZEXT816(0) << 0x40);
                                              auVar132._16_16_ = auVar104;
                                              auVar132._0_16_ = auVar105;
                                              auVar121._0_4_ = auVar105._0_4_ ^ auVar109._0_4_;
                                              auVar121._4_4_ = auVar105._4_4_ ^ auVar109._4_4_;
                                              auVar121._8_4_ = auVar105._8_4_ ^ auVar109._8_4_;
                                              auVar121._12_4_ = auVar105._12_4_ ^ auVar109._12_4_;
                                              auVar121._16_4_ = auVar104._0_4_ ^ auVar109._16_4_;
                                              auVar121._20_4_ = auVar104._4_4_ ^ auVar109._20_4_;
                                              auVar121._24_4_ = auVar104._8_4_ ^ auVar109._24_4_;
                                              auVar121._28_4_ = auVar104._12_4_ ^ auVar109._28_4_;
                                              auVar144._8_4_ = 0xff800000;
                                              auVar144._0_8_ = 0xff800000ff800000;
                                              auVar144._12_4_ = 0xff800000;
                                              auVar144._16_4_ = 0xff800000;
                                              auVar144._20_4_ = 0xff800000;
                                              auVar144._24_4_ = 0xff800000;
                                              auVar144._28_4_ = 0xff800000;
                                              auVar109 = vblendvps_avx(auVar144,*(undefined1
                                                                                  (*) [32])
                                                                                 (local_2d50.ray +
                                                                                 0x100),auVar132);
                                              *(undefined1 (*) [32])(local_2d50.ray + 0x100) =
                                                   auVar109;
                                            }
                                            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar121 >> 0x3f & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar121 >> 0x5f & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                                                  (auVar121 & (undefined1  [32])0x100000000) !=
                                                  (undefined1  [32])0x0) ||
                                                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                                                (auVar121 & (undefined1  [32])0x100000000) !=
                                                (undefined1  [32])0x0) || auVar121[0x1f] < '\0')
                                            goto LAB_00376736;
                                            *(int *)(local_2f08 + lVar89 * 4) = auVar147._0_4_;
                                            auVar95 = (undefined1  [8])
                                                      ((ulong)auVar95 ^ 1L << (uVar93 & 0x3f));
                                            uVar93 = 0;
                                            if (auVar95 != (undefined1  [8])0x0) {
                                              for (; ((ulong)auVar95 >> uVar93 & 1) == 0;
                                                  uVar93 = uVar93 + 1) {
                                              }
                                            }
                                            auVar161 = local_2ec0;
                                          } while (auVar95 != (undefined1  [8])0x0);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              local_2ec0 = auVar161;
                              uVar91 = local_2e00._0_8_ & local_2e00._0_8_ - 1;
                              uVar93 = uVar88;
                              pRVar100 = ray;
                              pRVar101 = context;
                            } while (uVar91 != 0);
                            in_ZMM13 = ZEXT3264(local_2860);
                            uVar88 = local_2e48;
                            lVar89 = local_2e50;
                            puVar96 = local_2f20;
                            pauVar97 = local_2f28;
                            auVar109 = local_2800;
                          }
                          unaff_RBX = 0;
                          auVar125 = auVar109 & local_2ce0;
                          bVar102 = (((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar125 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0'
                                       ) && (auVar125 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar125 >> 0xbf,0) == '\0') &&
                                    (auVar125 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar125[0x1f];
                          auVar109 = vandps_avx(auVar109,local_2ce0);
                          auVar135 = ZEXT3264(auVar109);
                        }
                        auVar109 = vcmpps_avx(auVar144,auVar144,0xf);
                        auVar147 = ZEXT3264(auVar109);
                      } while ((!bVar102) && (uVar88 = uVar88 & uVar88 - 1, uVar88 != 0));
                    }
                    auVar105 = auVar147._0_16_;
                    lVar89 = local_2e58 + 1;
                  } while (lVar89 != local_2e60);
                  auVar133._0_4_ = auVar135._0_4_ ^ auVar147._0_4_;
                  auVar133._4_4_ = auVar135._4_4_ ^ auVar147._4_4_;
                  auVar133._8_4_ = auVar135._8_4_ ^ auVar147._8_4_;
                  auVar133._12_4_ = auVar135._12_4_ ^ auVar147._12_4_;
                  auVar133._16_4_ = auVar135._16_4_ ^ auVar147._16_4_;
                  auVar133._20_4_ = auVar135._20_4_ ^ auVar147._20_4_;
                  auVar133._24_4_ = auVar135._24_4_ ^ auVar147._24_4_;
                  auVar133._28_4_ = auVar135._28_4_ ^ auVar147._28_4_;
                }
                _local_2ea0 = vorps_avx(_local_2ea0,auVar133);
                auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                auVar104 = vpcmpgtd_avx(local_2ea0._16_16_,auVar105);
                auVar105 = vpcmpgtd_avx(local_2ea0._0_16_,auVar105);
                auVar105 = vpor_avx(auVar105,auVar104);
                if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar105[0xf]) goto LAB_00376c7e;
                auVar145._8_4_ = 0xff800000;
                auVar145._0_8_ = 0xff800000ff800000;
                auVar145._12_4_ = 0xff800000;
                auVar145._16_4_ = 0xff800000;
                auVar145._20_4_ = 0xff800000;
                auVar145._24_4_ = 0xff800000;
                auVar145._28_4_ = 0xff800000;
                auVar147 = ZEXT3264(auVar145);
                local_2b20 = vblendvps_avx(local_2b20,auVar145,_local_2ea0);
              }
              goto LAB_003754fa;
            }
            uVar83 = root.ptr & 0xfffffffffffffff0;
            local_2da0 = vcmpps_avx(local_2b20,auVar135._0_32_,6);
            auVar110._8_4_ = 0x7f800000;
            auVar110._0_8_ = 0x7f8000007f800000;
            auVar110._12_4_ = 0x7f800000;
            auVar110._16_4_ = 0x7f800000;
            auVar110._20_4_ = 0x7f800000;
            auVar110._24_4_ = 0x7f800000;
            auVar110._28_4_ = 0x7f800000;
            lVar89 = -0x10;
            root.ptr = 8;
            do {
              auVar109 = auVar110;
              uVar88 = *(ulong *)(uVar83 + 0x20 + lVar89 * 2);
              if (uVar88 == 8) {
                auVar135 = ZEXT3264(auVar109);
                break;
              }
              fVar205 = *(float *)(uVar83 + 0x90 + lVar89);
              fVar149 = *(float *)(uVar83 + 0x30 + lVar89);
              auVar125 = *(undefined1 (*) [32])(ray + 0xe0);
              fVar152 = auVar125._0_4_;
              fVar153 = auVar125._4_4_;
              fVar154 = auVar125._8_4_;
              fVar177 = auVar125._12_4_;
              fVar178 = auVar125._16_4_;
              fVar179 = auVar125._20_4_;
              fVar180 = auVar125._24_4_;
              fVar150 = *(float *)(uVar83 + 0xb0 + lVar89);
              auVar162._0_4_ = fVar152 * fVar205 + fVar149;
              auVar162._4_4_ = fVar153 * fVar205 + fVar149;
              auVar162._8_4_ = fVar154 * fVar205 + fVar149;
              auVar162._12_4_ = fVar177 * fVar205 + fVar149;
              auVar162._16_4_ = fVar178 * fVar205 + fVar149;
              auVar162._20_4_ = fVar179 * fVar205 + fVar149;
              auVar162._24_4_ = fVar180 * fVar205 + fVar149;
              auVar162._28_4_ = fVar205 + fVar149;
              fVar205 = *(float *)(uVar83 + 0x50 + lVar89);
              fVar149 = *(float *)(uVar83 + 0xd0 + lVar89);
              fVar151 = *(float *)(uVar83 + 0x70 + lVar89);
              auVar172._0_4_ = fVar152 * fVar150 + fVar205;
              auVar172._4_4_ = fVar153 * fVar150 + fVar205;
              auVar172._8_4_ = fVar154 * fVar150 + fVar205;
              auVar172._12_4_ = fVar177 * fVar150 + fVar205;
              auVar172._16_4_ = fVar178 * fVar150 + fVar205;
              auVar172._20_4_ = fVar179 * fVar150 + fVar205;
              auVar172._24_4_ = fVar180 * fVar150 + fVar205;
              auVar172._28_4_ = fVar150 + fVar205;
              fVar205 = *(float *)(uVar83 + 0xa0 + lVar89);
              auVar191._0_4_ = fVar152 * fVar149 + fVar151;
              auVar191._4_4_ = fVar153 * fVar149 + fVar151;
              auVar191._8_4_ = fVar154 * fVar149 + fVar151;
              auVar191._12_4_ = fVar177 * fVar149 + fVar151;
              auVar191._16_4_ = fVar178 * fVar149 + fVar151;
              auVar191._20_4_ = fVar179 * fVar149 + fVar151;
              auVar191._24_4_ = fVar180 * fVar149 + fVar151;
              auVar191._28_4_ = fVar150 + fVar151;
              fVar149 = *(float *)(uVar83 + 0x40 + lVar89);
              fVar150 = *(float *)(uVar83 + 0xc0 + lVar89);
              fVar151 = *(float *)(uVar83 + 0x60 + lVar89);
              auVar201._0_4_ = fVar152 * fVar205 + fVar149;
              auVar201._4_4_ = fVar153 * fVar205 + fVar149;
              auVar201._8_4_ = fVar154 * fVar205 + fVar149;
              auVar201._12_4_ = fVar177 * fVar205 + fVar149;
              auVar201._16_4_ = fVar178 * fVar205 + fVar149;
              auVar201._20_4_ = fVar179 * fVar205 + fVar149;
              auVar201._24_4_ = fVar180 * fVar205 + fVar149;
              auVar201._28_4_ = fVar205 + fVar149;
              fVar205 = *(float *)(uVar83 + 0xe0 + lVar89);
              auVar212._0_4_ = fVar151 + fVar150 * fVar152;
              auVar212._4_4_ = fVar151 + fVar150 * fVar153;
              auVar212._8_4_ = fVar151 + fVar150 * fVar154;
              auVar212._12_4_ = fVar151 + fVar150 * fVar177;
              auVar212._16_4_ = fVar151 + fVar150 * fVar178;
              auVar212._20_4_ = fVar151 + fVar150 * fVar179;
              auVar212._24_4_ = fVar151 + fVar150 * fVar180;
              auVar212._28_4_ = fVar151 + fVar149;
              fVar149 = *(float *)(uVar83 + 0x80 + lVar89);
              auVar230._0_4_ = fVar205 * fVar152 + fVar149;
              auVar230._4_4_ = fVar205 * fVar153 + fVar149;
              auVar230._8_4_ = fVar205 * fVar154 + fVar149;
              auVar230._12_4_ = fVar205 * fVar177 + fVar149;
              auVar230._16_4_ = fVar205 * fVar178 + fVar149;
              auVar230._20_4_ = fVar205 * fVar179 + fVar149;
              auVar230._24_4_ = fVar205 * fVar180 + fVar149;
              auVar230._28_4_ = fVar205 + fVar149;
              auVar75._8_8_ = local_2cc0._8_8_;
              auVar75._0_8_ = local_2cc0._0_8_;
              auVar75._16_8_ = local_2cc0._16_8_;
              auVar75._24_8_ = local_2cc0._24_8_;
              auVar77._8_8_ = local_2cc0._40_8_;
              auVar77._0_8_ = local_2cc0._32_8_;
              auVar77._16_8_ = local_2cc0._48_8_;
              auVar77._24_8_ = local_2cc0._56_8_;
              auVar79._8_8_ = local_2cc0._72_8_;
              auVar79._0_8_ = local_2cc0._64_8_;
              auVar79._16_8_ = local_2cc0._80_8_;
              auVar79._24_8_ = local_2cc0._88_8_;
              auVar160 = vsubps_avx(auVar162,auVar75);
              auVar155._0_4_ = (float)local_2c00._0_4_ * auVar160._0_4_;
              auVar155._4_4_ = (float)local_2c00._4_4_ * auVar160._4_4_;
              auVar155._8_4_ = fStack_2bf8 * auVar160._8_4_;
              auVar155._12_4_ = fStack_2bf4 * auVar160._12_4_;
              auVar23._16_4_ = fStack_2bf0 * auVar160._16_4_;
              auVar23._0_16_ = auVar155;
              auVar23._20_4_ = fStack_2bec * auVar160._20_4_;
              auVar23._24_4_ = fStack_2be8 * auVar160._24_4_;
              auVar23._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar172,auVar77);
              auVar166._0_4_ = (float)local_2be0._0_4_ * auVar160._0_4_;
              auVar166._4_4_ = (float)local_2be0._4_4_ * auVar160._4_4_;
              auVar166._8_4_ = fStack_2bd8 * auVar160._8_4_;
              auVar166._12_4_ = fStack_2bd4 * auVar160._12_4_;
              auVar24._16_4_ = fStack_2bd0 * auVar160._16_4_;
              auVar24._0_16_ = auVar166;
              auVar24._20_4_ = fStack_2bcc * auVar160._20_4_;
              auVar24._24_4_ = fStack_2bc8 * auVar160._24_4_;
              auVar24._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar191,auVar79);
              auVar183._0_4_ = (float)local_2bc0._0_4_ * auVar160._0_4_;
              auVar183._4_4_ = (float)local_2bc0._4_4_ * auVar160._4_4_;
              auVar183._8_4_ = fStack_2bb8 * auVar160._8_4_;
              auVar183._12_4_ = fStack_2bb4 * auVar160._12_4_;
              auVar25._16_4_ = fStack_2bb0 * auVar160._16_4_;
              auVar25._0_16_ = auVar183;
              auVar25._20_4_ = fStack_2bac * auVar160._20_4_;
              auVar25._24_4_ = fStack_2ba8 * auVar160._24_4_;
              auVar25._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar201,auVar75);
              auVar197._0_4_ = (float)local_2c00._0_4_ * auVar160._0_4_;
              auVar197._4_4_ = (float)local_2c00._4_4_ * auVar160._4_4_;
              auVar197._8_4_ = fStack_2bf8 * auVar160._8_4_;
              auVar197._12_4_ = fStack_2bf4 * auVar160._12_4_;
              auVar26._16_4_ = fStack_2bf0 * auVar160._16_4_;
              auVar26._0_16_ = auVar197;
              auVar26._20_4_ = fStack_2bec * auVar160._20_4_;
              auVar26._24_4_ = fStack_2be8 * auVar160._24_4_;
              auVar26._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar212,auVar77);
              auVar207._0_4_ = (float)local_2be0._0_4_ * auVar160._0_4_;
              auVar207._4_4_ = (float)local_2be0._4_4_ * auVar160._4_4_;
              auVar207._8_4_ = fStack_2bd8 * auVar160._8_4_;
              auVar207._12_4_ = fStack_2bd4 * auVar160._12_4_;
              auVar27._16_4_ = fStack_2bd0 * auVar160._16_4_;
              auVar27._0_16_ = auVar207;
              auVar27._20_4_ = fStack_2bcc * auVar160._20_4_;
              auVar27._24_4_ = fStack_2bc8 * auVar160._24_4_;
              auVar27._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar230,auVar79);
              auVar227._0_4_ = auVar160._0_4_ * (float)local_2bc0._0_4_;
              auVar227._4_4_ = auVar160._4_4_ * (float)local_2bc0._4_4_;
              auVar227._8_4_ = auVar160._8_4_ * fStack_2bb8;
              auVar227._12_4_ = auVar160._12_4_ * fStack_2bb4;
              auVar28._16_4_ = auVar160._16_4_ * fStack_2bb0;
              auVar28._0_16_ = auVar227;
              auVar28._20_4_ = auVar160._20_4_ * fStack_2bac;
              auVar28._24_4_ = auVar160._24_4_ * fStack_2ba8;
              auVar28._28_4_ = auVar160._28_4_;
              auVar105 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar104 = vpminsd_avx(auVar155,auVar197);
              auVar156 = auVar27._16_16_;
              in_ZMM13 = ZEXT1664(auVar156);
              auVar167 = vpminsd_avx(auVar24._16_16_,auVar156);
              auVar105 = vpmaxsd_avx(auVar105,auVar167);
              auVar167 = vpminsd_avx(auVar166,auVar207);
              auVar104 = vpmaxsd_avx(auVar104,auVar167);
              auVar167 = vpminsd_avx(auVar183,auVar227);
              auVar104 = vpmaxsd_avx(auVar104,auVar167);
              auVar167 = vpminsd_avx(auVar25._16_16_,auVar28._16_16_);
              auVar105 = vpmaxsd_avx(auVar105,auVar167);
              auVar167 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
              auVar103 = vpmaxsd_avx(auVar155,auVar197);
              auVar155 = vpmaxsd_avx(auVar24._16_16_,auVar156);
              auVar155 = vpminsd_avx(auVar167,auVar155);
              auVar167 = vpmaxsd_avx(auVar166,auVar207);
              auVar103 = vpminsd_avx(auVar103,auVar167);
              auVar167 = vpmaxsd_avx(auVar183,auVar227);
              auVar167 = vpminsd_avx(auVar103,auVar167);
              auVar156._0_4_ = auVar104._0_4_ * 0.99999964;
              auVar156._4_4_ = auVar104._4_4_ * 0.99999964;
              auVar156._8_4_ = auVar104._8_4_ * 0.99999964;
              auVar156._12_4_ = auVar104._12_4_ * 0.99999964;
              auVar29._16_4_ = auVar105._0_4_ * 0.99999964;
              auVar29._0_16_ = auVar156;
              auVar29._20_4_ = auVar105._4_4_ * 0.99999964;
              auVar29._24_4_ = auVar105._8_4_ * 0.99999964;
              auVar29._28_4_ = 0x3f7ffffa;
              auVar105 = vpmaxsd_avx(auVar25._16_16_,auVar28._16_16_);
              auVar105 = vpminsd_avx(auVar155,auVar105);
              auVar103._0_4_ = auVar167._0_4_ * 1.0000004;
              auVar103._4_4_ = auVar167._4_4_ * 1.0000004;
              auVar103._8_4_ = auVar167._8_4_ * 1.0000004;
              auVar103._12_4_ = auVar167._12_4_ * 1.0000004;
              auVar30._16_4_ = auVar105._0_4_ * 1.0000004;
              auVar30._0_16_ = auVar103;
              auVar30._20_4_ = auVar105._4_4_ * 1.0000004;
              auVar30._24_4_ = auVar105._8_4_ * 1.0000004;
              auVar30._28_4_ = auVar105._12_4_;
              auVar105 = vpmaxsd_avx(auVar156,local_2b40._0_16_);
              auVar104 = vpmaxsd_avx(auVar29._16_16_,local_2b40._16_16_);
              auVar167 = vpminsd_avx(auVar103,local_2b20._0_16_);
              auVar103 = vpminsd_avx(auVar30._16_16_,local_2b20._16_16_);
              auVar127._16_16_ = auVar104;
              auVar127._0_16_ = auVar105;
              auVar111._16_16_ = auVar103;
              auVar111._0_16_ = auVar167;
              auVar160 = vcmpps_avx(auVar127,auVar111,2);
              if ((uVar86 & 7) == 6) {
                uVar92 = *(undefined4 *)(uVar83 + 0xf0 + lVar89);
                auVar114._4_4_ = uVar92;
                auVar114._0_4_ = uVar92;
                auVar114._8_4_ = uVar92;
                auVar114._12_4_ = uVar92;
                auVar114._16_4_ = uVar92;
                auVar114._20_4_ = uVar92;
                auVar114._24_4_ = uVar92;
                auVar114._28_4_ = uVar92;
                auVar161 = vcmpps_avx(auVar114,auVar125,2);
                uVar92 = *(undefined4 *)(uVar83 + 0x100 + lVar89);
                auVar129._4_4_ = uVar92;
                auVar129._0_4_ = uVar92;
                auVar129._8_4_ = uVar92;
                auVar129._12_4_ = uVar92;
                auVar129._16_4_ = uVar92;
                auVar129._20_4_ = uVar92;
                auVar129._24_4_ = uVar92;
                auVar129._28_4_ = uVar92;
                auVar125 = vcmpps_avx(auVar125,auVar129,1);
                auVar125 = vandps_avx(auVar161,auVar125);
                auVar125 = vandps_avx(auVar125,auVar160);
                auVar105 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              }
              else {
                auVar105 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              }
              auVar104 = vpackssdw_avx(local_2da0._0_16_,local_2da0._16_16_);
              auVar105 = vpand_avx(auVar105,auVar104);
              auVar147 = ZEXT1664(auVar105);
              auVar104 = vpmovzxwd_avx(auVar105);
              auVar167 = vpslld_avx(auVar104,0x1f);
              auVar104 = vpunpckhwd_avx(auVar105,auVar105);
              auVar104 = vpslld_avx(auVar104,0x1f);
              auVar112._16_16_ = auVar104;
              auVar112._0_16_ = auVar167;
              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar112 >> 0x7f,0) == '\0') &&
                    (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar104 >> 0x3f,0) == '\0') &&
                  (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar104[0xf]) {
                auVar135 = ZEXT3264(auVar109);
                uVar88 = root.ptr;
              }
              else {
                auVar105 = vpunpckhwd_avx(auVar105,auVar105);
                auVar105 = vpslld_avx(auVar105,0x1f);
                auVar113._16_16_ = auVar105;
                auVar113._0_16_ = auVar167;
                auVar128._8_4_ = 0x7f800000;
                auVar128._0_8_ = 0x7f8000007f800000;
                auVar128._12_4_ = 0x7f800000;
                auVar128._16_4_ = 0x7f800000;
                auVar128._20_4_ = 0x7f800000;
                auVar128._24_4_ = 0x7f800000;
                auVar128._28_4_ = 0x7f800000;
                auVar125 = vblendvps_avx(auVar128,auVar29,auVar113);
                auVar135 = ZEXT3264(auVar125);
                if (root.ptr != 8) {
                  *puVar96 = root.ptr;
                  puVar96 = puVar96 + 1;
                  local_2e00._0_8_ = auVar109._0_8_;
                  local_2e00._8_8_ = auVar109._8_8_;
                  uStack_2df0 = auVar109._16_8_;
                  uStack_2de8 = auVar109._24_8_;
                  *(undefined8 *)*pauVar97 = local_2e00._0_8_;
                  *(undefined8 *)(*pauVar97 + 8) = local_2e00._8_8_;
                  *(undefined8 *)(*pauVar97 + 0x10) = uStack_2df0;
                  *(undefined8 *)(*pauVar97 + 0x18) = uStack_2de8;
                  pauVar97 = pauVar97 + 1;
                }
              }
              root.ptr = uVar88;
              lVar89 = lVar89 + 4;
              auVar110 = auVar135._0_32_;
              _local_2e00 = auVar109;
            } while (lVar89 != 0);
            if (root.ptr == 8) goto LAB_003758b5;
            auVar109 = vcmpps_avx(local_2b20,auVar135._0_32_,6);
            uVar92 = vmovmskps_avx(auVar109);
          } while ((byte)local_2f30 < (byte)POPCOUNT(uVar92));
          *puVar96 = root.ptr;
          puVar96 = puVar96 + 1;
          *pauVar97 = auVar135._0_32_;
          pauVar97 = pauVar97 + 1;
LAB_003758b5:
          iVar81 = 4;
        }
        else {
          for (; local_2da0 = auVar109, unaff_RBX != 0; unaff_RBX = unaff_RBX & unaff_RBX - 1) {
            k = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> k & 1) == 0; k = k + 1) {
              }
            }
            local_2e00._0_8_ = k;
            auVar147 = ZEXT1664(auVar147._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            local_2f28 = pauVar97;
            local_2f20 = puVar96;
            bVar102 = occluded1(local_2e68,local_2e70,root,k,&local_2f32,ray,
                                (TravRayK<8,_true> *)&local_2cc0.field_0,context);
            auVar105 = auVar147._0_16_;
            if (bVar102) {
              *(undefined4 *)(local_2ea0 + local_2e00._0_8_ * 4) = 0xffffffff;
            }
            puVar96 = local_2f20;
            pauVar97 = local_2f28;
            auVar109 = local_2da0;
          }
          auVar105 = vpcmpeqd_avx(auVar105,auVar105);
          auVar104 = vpcmpgtd_avx(stack0xffffffffffffd170,auVar105);
          auVar105 = vpcmpgtd_avx(local_2ea0._0_16_,auVar105);
          auVar147 = ZEXT1664(auVar105);
          auVar105 = vpor_avx(auVar105,auVar104);
          iVar81 = 3;
          if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar105[0xf] < '\0') {
            auVar146._8_4_ = 0xff800000;
            auVar146._0_8_ = 0xff800000ff800000;
            auVar146._12_4_ = 0xff800000;
            auVar146._16_4_ = 0xff800000;
            auVar146._20_4_ = 0xff800000;
            auVar146._24_4_ = 0xff800000;
            auVar146._28_4_ = 0xff800000;
            auVar147 = ZEXT3264(auVar146);
            local_2b20 = vblendvps_avx(local_2b20,auVar146,_local_2ea0);
            iVar81 = 2;
          }
          unaff_RBX = 0;
          auVar109 = local_2da0;
          if ((uint)local_2f30 < (uint)POPCOUNT(uVar92)) goto LAB_0037553a;
        }
      } while (iVar81 != 3);
LAB_00376c7e:
      auVar109 = vandps_avx(local_2880,_local_2ea0);
      auVar134._8_4_ = 0xff800000;
      auVar134._0_8_ = 0xff800000ff800000;
      auVar134._12_4_ = 0xff800000;
      auVar134._16_4_ = 0xff800000;
      auVar134._20_4_ = 0xff800000;
      auVar134._24_4_ = 0xff800000;
      auVar134._28_4_ = 0xff800000;
      auVar109 = vmaskmovps_avx(auVar109,auVar134);
      *(undefined1 (*) [32])local_2f08 = auVar109;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }